

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_fma::forward
          (BinaryOp_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  int _elempack;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Mat *this_00;
  _func_int *p_Var6;
  size_t sVar7;
  size_t sVar8;
  Allocator *pAVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 uVar24;
  undefined3 uVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  __m256 afVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  float *pfVar34;
  undefined1 (*pauVar35) [32];
  Option *pOVar36;
  undefined1 (*pauVar37) [32];
  Mat *pMVar38;
  __m256 *pafVar39;
  undefined8 *puVar40;
  long lVar41;
  void *pvVar42;
  Mat *pMVar43;
  float *pfVar44;
  undefined1 (*pauVar45) [32];
  undefined1 (*pauVar46) [16];
  int iVar47;
  Mat *a;
  ulong uVar48;
  int y;
  uint uVar49;
  uint uVar50;
  long lVar51;
  __m256 *pafVar52;
  undefined1 (*pauVar53) [16];
  uint uVar54;
  long lVar55;
  void *pvVar56;
  __m256 *pafVar57;
  undefined1 (*pauVar58) [16];
  void *pvVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined8 uVar96;
  undefined1 auVar95 [56];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined8 uVar93;
  undefined8 uVar97;
  undefined1 auVar83 [64];
  undefined8 uVar94;
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  float in_register_0000125c;
  __m128 afVar98;
  binary_op_pow op;
  __m256 _p1;
  __m256 _a0;
  binary_op_pow local_111;
  Option *local_110;
  Mat *local_108;
  __m256 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  Mat *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  int local_c4;
  __m256 local_c0;
  __m256 local_a0;
  size_t local_68;
  uint local_5c;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar38 = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar29 = a->elempack;
  _elempack = a[1].elempack;
  local_110 = opt;
  local_108 = pMVar38;
  if (_elempack != 8 && iVar29 != 8) {
switchD_003cffc9_default:
    p_Var6 = this->_vptr_BinaryOp_x86_fma[-3];
    if (_elempack != 4 && iVar29 != 4) {
switchD_003d0136_default:
      iVar29 = BinaryOp::forward((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_fma + (long)p_Var6),
                                 bottom_blobs,top_blobs,opt);
      return iVar29;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var6)) {
    case 0:
      if (3 < a->dims - 1U) {
LAB_003dd905:
        return 0;
      }
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      uVar54 = a->w;
      uVar30 = a->h;
      iVar33 = a->d;
      uVar49 = a->c;
      uVar32 = (ulong)uVar49;
      local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
      sVar7 = a->elemsize;
      uVar50 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar31 = (ulong)uVar3;
      iVar47 = uVar5 * uVar50 * iVar4;
      sVar8 = a[1].elemsize;
      local_e0 = uVar31;
      switch(a->dims) {
      case 1:
        if (iVar29 == 1 && uVar54 == 1) {
LAB_003d01c8:
          local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
          local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                             (a,pMVar38,this_00,(Option *)opt->blob_allocator);
          return iVar29;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar34 = (float *)this_00->data;
          if (pfVar34 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar53 = (undefined1 (*) [16])a->data;
          pfVar44 = (float *)a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar64 = *pauVar53;
              uVar30 = uVar50;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                *pfVar34 = auVar64._0_4_ + *pfVar44;
                pfVar34[1] = auVar64._4_4_ + fVar2;
                pfVar34[2] = auVar64._8_4_ + fVar16;
                pfVar34[3] = auVar64._12_4_ + fVar17;
                pfVar44 = pfVar44 + 4;
                pfVar34 = pfVar34 + 4;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar64._0_4_ + *pfVar34;
                pfVar44[1] = auVar64._4_4_ + fVar2;
                pfVar44[2] = auVar64._8_4_ + fVar16;
                pfVar44[3] = auVar64._12_4_ + fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar64._0_4_ + *pfVar34;
                pfVar44[1] = auVar64._4_4_ + fVar2;
                pfVar44[2] = auVar64._8_4_ + fVar16;
                pfVar44[3] = auVar64._12_4_ + fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da8d0;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar5) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar53 = (undefined1 (*) [16])((long)a->w * uVar32 * a->elemsize + (long)a->data);
              uVar54 = 0;
              do {
                if (0 < (int)uVar50) {
                  auVar64 = *pauVar53;
                  uVar30 = uVar50;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    *pfVar34 = auVar64._0_4_ + *pfVar44;
                    pfVar34[1] = auVar64._4_4_ + fVar2;
                    pfVar34[2] = auVar64._8_4_ + fVar16;
                    pfVar34[3] = auVar64._12_4_ + fVar17;
                    pfVar44 = pfVar44 + 4;
                    pfVar34 = pfVar34 + 4;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar5);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_e8->w * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar64 = *pauVar53;
                  uVar54 = 0;
                  do {
                    uVar30 = uVar50;
                    if (0 < (int)uVar50) {
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ + *pfVar44;
                        pfVar34[1] = auVar64._4_4_ + fVar2;
                        pfVar34[2] = auVar64._8_4_ + fVar16;
                        pfVar34[3] = auVar64._12_4_ + fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                pauVar53 = pauVar53 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_e8[1].dims;
        if (iVar29 != 1) goto LAB_003d541b;
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pfVar34 = (float *)this_00->data;
        if (pfVar34 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pfVar44 = (float *)local_e8->data;
          pauVar53 = (undefined1 (*) [16])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar64 = *pauVar53;
              uVar50 = uVar54;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                *pfVar34 = auVar64._0_4_ + *pfVar44;
                pfVar34[1] = auVar64._4_4_ + fVar2;
                pfVar34[2] = auVar64._8_4_ + fVar16;
                pfVar34[3] = auVar64._12_4_ + fVar17;
                pfVar44 = pfVar44 + 4;
                pfVar34 = pfVar34 + 4;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_d0 = sVar7;
          if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)local_f8) {
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                auVar64 = *(undefined1 (*) [16])
                           ((long)a[1].data + a[1].cstep * uVar31 * a[1].elemsize);
                pvVar42 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar56 = a->data;
                lVar55 = 0;
                iVar29 = (int)local_f8;
                do {
                  pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                  fVar2 = pfVar34[1];
                  fVar16 = pfVar34[2];
                  fVar17 = pfVar34[3];
                  pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                  *pfVar44 = auVar64._0_4_ + *pfVar34;
                  pfVar44[1] = auVar64._4_4_ + fVar2;
                  pfVar44[2] = auVar64._8_4_ + fVar16;
                  pfVar44[3] = auVar64._12_4_ + fVar17;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          local_d8 = sVar8;
          if (uVar50 == uVar54) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
              Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar42 = this_00->data;
                  pvVar56 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar59 = a->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    fVar2 = *(float *)((long)pvVar56 + lVar55);
                    pfVar34 = (float *)((long)pvVar59 + lVar55 * 4 + sVar10 * sVar11 * uVar31);
                    auVar62._0_4_ = fVar2 + *pfVar34;
                    auVar62._4_4_ = fVar2 + pfVar34[1];
                    auVar62._8_4_ = fVar2 + pfVar34[2];
                    auVar62._12_4_ = fVar2 + pfVar34[3];
                    *(undefined1 (*) [16])((long)pvVar42 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar62;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            local_f8 = CONCAT44(local_f8._4_4_,iVar47);
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003dac3e:
              local_f8 = CONCAT44(local_f8._4_4_,iVar47);
              Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar32 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  auVar64 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar32 * a->elemsize);
                  pvVar42 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar56 = this_00->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                    fVar2 = pfVar34[1];
                    fVar16 = pfVar34[2];
                    fVar17 = pfVar34[3];
                    pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                    *pfVar44 = auVar64._0_4_ + *pfVar34;
                    pfVar44[1] = auVar64._4_4_ + fVar2;
                    pfVar44[2] = auVar64._8_4_ + fVar16;
                    pfVar44[3] = auVar64._12_4_ + fVar17;
                    lVar55 = lVar55 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar31);
              return 0;
            }
            if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
              Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_e0 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar42 = a->data;
                  pvVar56 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar59 = a[1].data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    fVar2 = *(float *)((long)pvVar42 + lVar55);
                    pfVar34 = (float *)((long)pvVar59 + lVar55 * 4 + sVar10 * sVar11 * uVar31);
                    auVar69._0_4_ = fVar2 + *pfVar34;
                    auVar69._4_4_ = fVar2 + pfVar34[1];
                    auVar69._8_4_ = fVar2 + pfVar34[2];
                    auVar69._12_4_ = fVar2 + pfVar34[3];
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar69;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != local_e0);
              return 0;
            }
          }
          else {
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003dac3e;
          }
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar42 = a[1].data;
                  pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
                  uVar48 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar64 = *(undefined1 (*) [16])
                                 ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                      uVar49 = uVar54;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ + *pfVar44;
                        pfVar34[1] = auVar64._4_4_ + fVar2;
                        pfVar34[2] = auVar64._8_4_ + fVar16;
                        pfVar34[3] = auVar64._12_4_ + fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    uVar48 = uVar48 + 1;
                  } while (uVar48 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = local_e8[1].elemsize;
                  pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                    (long)local_e8->data);
                  sVar8 = local_e8[1].cstep;
                  pvVar42 = local_e8[1].data;
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar55 = 0;
                      do {
                        pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                        pfVar44 = (float *)((long)pvVar59 + lVar55);
                        auVar66._0_4_ = *pfVar34 + *pfVar44;
                        auVar66._4_4_ = pfVar34[1] + pfVar44[1];
                        auVar66._8_4_ = pfVar34[2] + pfVar44[2];
                        auVar66._12_4_ = pfVar34[3] + pfVar44[3];
                        *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar66;
                        lVar55 = lVar55 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar55);
                      pvVar56 = (void *)((long)pvVar56 + lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = local_e8->cstep;
                  sVar8 = local_e8->elemsize;
                  pvVar42 = local_e8->data;
                  pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                     (long)local_e8[1].data);
                  uVar48 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *(undefined1 (*) [16])
                                 ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                      uVar54 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ + *pfVar44;
                        pfVar34[1] = auVar64._4_4_ + fVar2;
                        pfVar34[2] = auVar64._8_4_ + fVar16;
                        pfVar34[3] = auVar64._12_4_ + fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar48 = uVar48 + 1;
                  } while (uVar48 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          pOVar36 = (Option *)opt->blob_allocator;
          local_e8 = a;
          if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
            Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar5) {
                  sVar7 = local_e8->elemsize;
                  pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                    (long)local_e8[1].data);
                  sVar8 = local_e8->cstep;
                  pvVar42 = local_e8->data;
                  uVar30 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar55 = 0;
                      do {
                        pfVar34 = (float *)((long)pvVar59 + lVar55);
                        pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                        auVar72._0_4_ = *pfVar34 + *pfVar44;
                        auVar72._4_4_ = pfVar34[1] + pfVar44[1];
                        auVar72._8_4_ = pfVar34[2] + pfVar44[2];
                        auVar72._12_4_ = pfVar34[3] + pfVar44[3];
                        *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar72;
                        lVar55 = lVar55 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar55);
                      pvVar56 = (void *)((long)pvVar56 + lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != uVar5);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          goto LAB_003d207c;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *pauVar53;
                      uVar30 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ + *pfVar44;
                        pfVar34[1] = auVar64._4_4_ + fVar2;
                        pfVar34[2] = auVar64._8_4_ + fVar16;
                        pfVar34[3] = auVar64._12_4_ + fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)uVar30) {
              pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_e8[1].w * uVar31 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pfVar44 = (float *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                 (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar64 = *pauVar53;
                  uVar50 = uVar54;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    *pfVar34 = auVar64._0_4_ + *pfVar44;
                    pfVar34[1] = auVar64._4_4_ + fVar2;
                    pfVar34[2] = auVar64._8_4_ + fVar16;
                    pfVar34[3] = auVar64._12_4_ + fVar17;
                    pfVar44 = pfVar44 + 4;
                    pfVar34 = pfVar34 + 4;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar64._0_4_ + *pfVar34;
                pfVar44[1] = auVar64._4_4_ + fVar2;
                pfVar44[2] = auVar64._8_4_ + fVar16;
                pfVar44[3] = auVar64._12_4_ + fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        break;
      case 4:
        pOVar36 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003d2074;
        Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar53 = (undefined1 (*) [16])
                           (a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
                pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar54) {
                        auVar64 = *pauVar53;
                        uVar50 = uVar54;
                        do {
                          fVar2 = pfVar44[1];
                          fVar16 = pfVar44[2];
                          fVar17 = pfVar44[3];
                          *pfVar34 = auVar64._0_4_ + *pfVar44;
                          pfVar34[1] = auVar64._4_4_ + fVar2;
                          pfVar34[2] = auVar64._8_4_ + fVar16;
                          pfVar34[3] = auVar64._12_4_ + fVar17;
                          pfVar44 = pfVar44 + 4;
                          pfVar34 = pfVar34 + 4;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      pauVar53 = pauVar53 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (iVar29 != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar33) {
              pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar53 = (undefined1 (*) [16])
                         ((long)a[1].w * uVar31 * a[1].elemsize + (long)a[1].data);
              pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  auVar64 = *pauVar53;
                  uVar49 = 0;
                  do {
                    uVar50 = uVar54;
                    if (0 < (int)uVar54) {
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ + *pfVar44;
                        pfVar34[1] = auVar64._4_4_ + fVar2;
                        pfVar34[2] = auVar64._8_4_ + fVar16;
                        pfVar34[3] = auVar64._12_4_ + fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                pauVar53 = pauVar53 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        if ((int)local_100 != 1 || a[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = a->data;
              sVar10 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                *pfVar44 = auVar64._0_4_ + *pfVar34;
                pfVar44[1] = auVar64._4_4_ + fVar2;
                pfVar44[2] = auVar64._8_4_ + fVar16;
                pfVar44[3] = auVar64._12_4_ + fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      goto LAB_003da8c7;
    case 1:
      pMVar43 = pMVar38;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      uVar54 = a->w;
      uVar30 = a->h;
      iVar33 = a->d;
      uVar49 = a->c;
      uVar32 = (ulong)uVar49;
      local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
      sVar7 = a->elemsize;
      uVar50 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar31 = (ulong)uVar3;
      iVar47 = uVar5 * uVar50 * iVar4;
      sVar8 = a[1].elemsize;
      local_e0 = uVar31;
      switch(a->dims) {
      case 1:
        if (iVar29 == 1 && uVar54 == 1) {
LAB_003d082c:
          local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
          local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                             (a,pMVar38,this_00,(Option *)opt->blob_allocator);
          return iVar29;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar34 = (float *)this_00->data;
          if (pfVar34 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar53 = (undefined1 (*) [16])a->data;
          pfVar44 = (float *)a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar64 = *pauVar53;
              uVar30 = uVar50;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                *pfVar34 = auVar64._0_4_ * *pfVar44;
                pfVar34[1] = auVar64._4_4_ * fVar2;
                pfVar34[2] = auVar64._8_4_ * fVar16;
                pfVar34[3] = auVar64._12_4_ * fVar17;
                pfVar44 = pfVar44 + 4;
                pfVar34 = pfVar34 + 4;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar64._0_4_ * *pfVar34;
                pfVar44[1] = auVar64._4_4_ * fVar2;
                pfVar44[2] = auVar64._8_4_ * fVar16;
                pfVar44[3] = auVar64._12_4_ * fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar64._0_4_ * *pfVar34;
                pfVar44[1] = auVar64._4_4_ * fVar2;
                pfVar44[2] = auVar64._8_4_ * fVar16;
                pfVar44[3] = auVar64._12_4_ * fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da7c2;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar5) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar53 = (undefined1 (*) [16])((long)a->w * uVar32 * a->elemsize + (long)a->data);
              uVar54 = 0;
              do {
                if (0 < (int)uVar50) {
                  auVar64 = *pauVar53;
                  uVar30 = uVar50;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    *pfVar34 = auVar64._0_4_ * *pfVar44;
                    pfVar34[1] = auVar64._4_4_ * fVar2;
                    pfVar34[2] = auVar64._8_4_ * fVar16;
                    pfVar34[3] = auVar64._12_4_ * fVar17;
                    pfVar44 = pfVar44 + 4;
                    pfVar34 = pfVar34 + 4;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar5);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_e8->w * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar64 = *pauVar53;
                  uVar54 = 0;
                  do {
                    uVar30 = uVar50;
                    if (0 < (int)uVar50) {
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ * *pfVar44;
                        pfVar34[1] = auVar64._4_4_ * fVar2;
                        pfVar34[2] = auVar64._8_4_ * fVar16;
                        pfVar34[3] = auVar64._12_4_ * fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                pauVar53 = pauVar53 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_e8[1].dims;
        if (iVar29 != 1) goto LAB_003d52a6;
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pfVar34 = (float *)this_00->data;
        if (pfVar34 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pfVar44 = (float *)local_e8->data;
          pauVar53 = (undefined1 (*) [16])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar64 = *pauVar53;
              uVar50 = uVar54;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                *pfVar34 = auVar64._0_4_ * *pfVar44;
                pfVar34[1] = auVar64._4_4_ * fVar2;
                pfVar34[2] = auVar64._8_4_ * fVar16;
                pfVar34[3] = auVar64._12_4_ * fVar17;
                pfVar44 = pfVar44 + 4;
                pfVar34 = pfVar34 + 4;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar53 = pauVar53 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_d0 = sVar7;
          if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)local_f8) {
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                auVar64 = *(undefined1 (*) [16])
                           ((long)a[1].data + a[1].cstep * uVar31 * a[1].elemsize);
                pvVar42 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar56 = a->data;
                lVar55 = 0;
                iVar29 = (int)local_f8;
                do {
                  pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                  fVar2 = pfVar34[1];
                  fVar16 = pfVar34[2];
                  fVar17 = pfVar34[3];
                  pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                  *pfVar44 = auVar64._0_4_ * *pfVar34;
                  pfVar44[1] = auVar64._4_4_ * fVar2;
                  pfVar44[2] = auVar64._8_4_ * fVar16;
                  pfVar44[3] = auVar64._12_4_ * fVar17;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          local_d8 = sVar8;
          if (uVar50 == uVar54) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
              Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar42 = this_00->data;
                  pvVar56 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar59 = a->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    fVar2 = *(float *)((long)pvVar56 + lVar55);
                    pfVar34 = (float *)((long)pvVar59 + lVar55 * 4 + sVar10 * sVar11 * uVar31);
                    auVar61._0_4_ = fVar2 * *pfVar34;
                    auVar61._4_4_ = fVar2 * pfVar34[1];
                    auVar61._8_4_ = fVar2 * pfVar34[2];
                    auVar61._12_4_ = fVar2 * pfVar34[3];
                    *(undefined1 (*) [16])((long)pvVar42 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar61;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            local_f8 = CONCAT44(local_f8._4_4_,iVar47);
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003dab39:
              local_f8 = CONCAT44(local_f8._4_4_,iVar47);
              Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar32 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  auVar64 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar32 * a->elemsize);
                  pvVar42 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar56 = this_00->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                    fVar2 = pfVar34[1];
                    fVar16 = pfVar34[2];
                    fVar17 = pfVar34[3];
                    pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                    *pfVar44 = auVar64._0_4_ * *pfVar34;
                    pfVar44[1] = auVar64._4_4_ * fVar2;
                    pfVar44[2] = auVar64._8_4_ * fVar16;
                    pfVar44[3] = auVar64._12_4_ * fVar17;
                    lVar55 = lVar55 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar31);
              return 0;
            }
            if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
              Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_e0 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar42 = a->data;
                  pvVar56 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar59 = a[1].data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    fVar2 = *(float *)((long)pvVar42 + lVar55);
                    pfVar34 = (float *)((long)pvVar59 + lVar55 * 4 + sVar10 * sVar11 * uVar31);
                    auVar68._0_4_ = fVar2 * *pfVar34;
                    auVar68._4_4_ = fVar2 * pfVar34[1];
                    auVar68._8_4_ = fVar2 * pfVar34[2];
                    auVar68._12_4_ = fVar2 * pfVar34[3];
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar68;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != local_e0);
              return 0;
            }
          }
          else {
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003dab39;
          }
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  pvVar42 = a[1].data;
                  pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
                  uVar48 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar64 = *(undefined1 (*) [16])
                                 ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                      uVar49 = uVar54;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ * *pfVar44;
                        pfVar34[1] = auVar64._4_4_ * fVar2;
                        pfVar34[2] = auVar64._8_4_ * fVar16;
                        pfVar34[3] = auVar64._12_4_ * fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar49 = uVar49 - 1;
                      } while (uVar49 != 0);
                    }
                    uVar48 = uVar48 + 1;
                  } while (uVar48 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = local_e8[1].elemsize;
                  pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                    (long)local_e8->data);
                  sVar8 = local_e8[1].cstep;
                  pvVar42 = local_e8[1].data;
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar55 = 0;
                      do {
                        pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                        pfVar44 = (float *)((long)pvVar59 + lVar55);
                        auVar65._0_4_ = *pfVar34 * *pfVar44;
                        auVar65._4_4_ = pfVar34[1] * pfVar44[1];
                        auVar65._8_4_ = pfVar34[2] * pfVar44[2];
                        auVar65._12_4_ = pfVar34[3] * pfVar44[3];
                        *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar65;
                        lVar55 = lVar55 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar55);
                      pvVar56 = (void *)((long)pvVar56 + lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar30) {
                  sVar7 = local_e8->cstep;
                  sVar8 = local_e8->elemsize;
                  pvVar42 = local_e8->data;
                  pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                     (long)this_00->data);
                  pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                     (long)local_e8[1].data);
                  uVar48 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *(undefined1 (*) [16])
                                 ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                      uVar54 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ * *pfVar44;
                        pfVar34[1] = auVar64._4_4_ * fVar2;
                        pfVar34[2] = auVar64._8_4_ * fVar16;
                        pfVar34[3] = auVar64._12_4_ * fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    uVar48 = uVar48 + 1;
                  } while (uVar48 != uVar30);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          pOVar36 = (Option *)opt->blob_allocator;
          local_e8 = a;
          if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
            Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)uVar5) {
                  sVar7 = local_e8->elemsize;
                  pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar59 = (void *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                    (long)local_e8[1].data);
                  sVar8 = local_e8->cstep;
                  pvVar42 = local_e8->data;
                  uVar30 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      lVar55 = 0;
                      do {
                        pfVar34 = (float *)((long)pvVar59 + lVar55);
                        pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                        auVar71._0_4_ = *pfVar34 * *pfVar44;
                        auVar71._4_4_ = pfVar34[1] * pfVar44[1];
                        auVar71._8_4_ = pfVar34[2] * pfVar44[2];
                        auVar71._12_4_ = pfVar34[3] * pfVar44[3];
                        *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar71;
                        lVar55 = lVar55 + 0x10;
                      } while ((ulong)uVar54 << 4 != lVar55);
                      pvVar56 = (void *)((long)pvVar56 + lVar55);
                      pvVar59 = (void *)((long)pvVar59 + lVar55);
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != uVar5);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            return -100;
          }
          goto LAB_003d1e25;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *pauVar53;
                      uVar30 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        *pfVar34 = auVar64._0_4_ * *pfVar44;
                        pfVar34[1] = auVar64._4_4_ * fVar2;
                        pfVar34[2] = auVar64._8_4_ * fVar16;
                        pfVar34[3] = auVar64._12_4_ * fVar17;
                        pfVar44 = pfVar44 + 4;
                        pfVar34 = pfVar34 + 4;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar53 = pauVar53 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)uVar30) {
              pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_e8[1].w * uVar31 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pfVar44 = (float *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                 (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar64 = *pauVar53;
                  uVar50 = uVar54;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    *pfVar34 = auVar64._0_4_ * *pfVar44;
                    pfVar34[1] = auVar64._4_4_ * fVar2;
                    pfVar34[2] = auVar64._8_4_ * fVar16;
                    pfVar34[3] = auVar64._12_4_ * fVar17;
                    pfVar44 = pfVar44 + 4;
                    pfVar34 = pfVar34 + 4;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar53 = pauVar53 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar64._0_4_ * *pfVar34;
                pfVar44[1] = auVar64._4_4_ * fVar2;
                pfVar44[2] = auVar64._8_4_ * fVar16;
                pfVar44[3] = auVar64._12_4_ * fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        break;
      case 4:
        pOVar36 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003d1e1d;
        Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar53 = (undefined1 (*) [16])
                           (a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
                pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar54) {
                        auVar64 = *pauVar53;
                        uVar50 = uVar54;
                        do {
                          fVar2 = pfVar44[1];
                          fVar16 = pfVar44[2];
                          fVar17 = pfVar44[3];
                          *pfVar34 = auVar64._0_4_ * *pfVar44;
                          pfVar34[1] = auVar64._4_4_ * fVar2;
                          pfVar34[2] = auVar64._8_4_ * fVar16;
                          pfVar34[3] = auVar64._12_4_ * fVar17;
                          pfVar44 = pfVar44 + 4;
                          pfVar34 = pfVar34 + 4;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      pauVar53 = pauVar53 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar53 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar31 * a[1].elemsize + (long)a[1].data);
                pfVar44 = (float *)(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    auVar64 = *pauVar53;
                    uVar49 = 0;
                    do {
                      uVar50 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          fVar2 = pfVar44[1];
                          fVar16 = pfVar44[2];
                          fVar17 = pfVar44[3];
                          *pfVar34 = auVar64._0_4_ * *pfVar44;
                          pfVar34[1] = auVar64._4_4_ * fVar2;
                          pfVar34[2] = auVar64._8_4_ * fVar16;
                          pfVar34[3] = auVar64._12_4_ * fVar17;
                          pfVar44 = pfVar44 + 4;
                          pfVar34 = pfVar34 + 4;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  pauVar53 = pauVar53 + 1;
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          return 0;
        }
        if ((int)local_100 != 1 || a[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = a->data;
              sVar10 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                *pfVar44 = auVar64._0_4_ * *pfVar34;
                pfVar44[1] = auVar64._4_4_ * fVar2;
                pfVar44[2] = auVar64._8_4_ * fVar16;
                pfVar44[3] = auVar64._12_4_ * fVar17;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      goto LAB_003da7b9;
    case 3:
      pMVar43 = pMVar38;
      goto LAB_003d09dd;
    case 4:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      uVar54 = a->w;
      uVar30 = a->h;
      iVar33 = a->d;
      uVar49 = a->c;
      uVar32 = (ulong)uVar49;
      local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
      sVar7 = a->elemsize;
      uVar50 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar31 = (ulong)uVar3;
      iVar47 = uVar5 * uVar50 * iVar4;
      sVar8 = a[1].elemsize;
      local_e0 = uVar31;
      switch(a->dims) {
      case 1:
        if (iVar29 == 1 && uVar54 == 1) {
LAB_003d077e:
          local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
          local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                             (a,pMVar38,this_00,(Option *)opt->blob_allocator);
          return iVar29;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar53 = (undefined1 (*) [16])this_00->data;
          if (pauVar53 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar58 = (undefined1 (*) [16])a->data;
          pauVar46 = (undefined1 (*) [16])a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar64 = *pauVar58;
              uVar30 = uVar50;
              do {
                auVar63 = vmaxps_avx(auVar64,*pauVar46);
                *pauVar53 = auVar63;
                pauVar46 = pauVar46 + 1;
                pauVar53 = pauVar53 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar58 = pauVar58 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da625;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar5) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar46 = (undefined1 (*) [16])((long)a->w * uVar32 * a->elemsize + (long)a->data);
              uVar54 = 0;
              do {
                if (0 < (int)uVar50) {
                  auVar64 = *pauVar46;
                  uVar30 = uVar50;
                  do {
                    auVar63 = vmaxps_avx(auVar64,*pauVar58);
                    *pauVar53 = auVar63;
                    pauVar58 = pauVar58 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                pauVar46 = pauVar46 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar5);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar46 = (undefined1 (*) [16])
                         ((long)local_e8->w * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar64 = *pauVar46;
                  uVar54 = 0;
                  do {
                    uVar30 = uVar50;
                    if (0 < (int)uVar50) {
                      do {
                        auVar63 = vmaxps_avx(auVar64,*pauVar58);
                        *pauVar53 = auVar63;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                pauVar46 = pauVar46 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_e8[1].dims;
        if (iVar29 != 1) goto LAB_003d4e1d;
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pauVar53 = (undefined1 (*) [16])this_00->data;
        if (pauVar53 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pauVar58 = (undefined1 (*) [16])local_e8->data;
          pauVar46 = (undefined1 (*) [16])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar64 = *pauVar46;
              uVar50 = uVar54;
              do {
                auVar63 = vmaxps_avx(auVar64,*pauVar58);
                *pauVar53 = auVar63;
                pauVar58 = pauVar58 + 1;
                pauVar53 = pauVar53 + 1;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar46 = pauVar46 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_d0 = sVar7;
          if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)local_f8) {
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                auVar64 = *(undefined1 (*) [16])
                           ((long)a[1].data + a[1].cstep * uVar31 * a[1].elemsize);
                pvVar42 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar56 = a->data;
                lVar55 = 0;
                iVar29 = (int)local_f8;
                do {
                  auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                                ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31))
                  ;
                  *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar63;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          local_d8 = sVar8;
          if (uVar50 == uVar54) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
              Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar42 = this_00->data;
                  pvVar56 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar59 = a->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar56 + lVar55);
                    auVar60._4_4_ = uVar1;
                    auVar60._0_4_ = uVar1;
                    auVar60._8_4_ = uVar1;
                    auVar60._12_4_ = uVar1;
                    auVar64 = vmaxps_avx(auVar60,*(undefined1 (*) [16])
                                                  ((long)pvVar59 +
                                                  lVar55 * 4 + sVar10 * sVar11 * uVar31));
                    *(undefined1 (*) [16])((long)pvVar42 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar64;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            local_f8 = CONCAT44(local_f8._4_4_,iVar47);
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003daa34:
              local_f8 = CONCAT44(local_f8._4_4_,iVar47);
              Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar32 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  auVar64 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar32 * a->elemsize);
                  pvVar42 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar56 = this_00->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                                  ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32))
                    ;
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32) =
                         auVar63;
                    lVar55 = lVar55 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar31);
              return 0;
            }
            if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
              Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_e0 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar42 = a->data;
                  pvVar56 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar59 = a[1].data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar42 + lVar55);
                    auVar67._4_4_ = uVar1;
                    auVar67._0_4_ = uVar1;
                    auVar67._8_4_ = uVar1;
                    auVar67._12_4_ = uVar1;
                    auVar64 = vmaxps_avx(auVar67,*(undefined1 (*) [16])
                                                  ((long)pvVar59 +
                                                  lVar55 * 4 + sVar10 * sVar11 * uVar31));
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar64;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != local_e0);
              return 0;
            }
          }
          else {
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003daa34;
          }
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar42 = a[1].data;
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar64 = *(undefined1 (*) [16])
                               ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                    uVar49 = uVar54;
                    do {
                      auVar63 = vmaxps_avx(auVar64,*pauVar58);
                      *pauVar53 = auVar63;
                      pauVar58 = pauVar58 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar49 = uVar49 - 1;
                    } while (uVar49 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = local_e8[1].elemsize;
                pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data
                                  );
                pvVar59 = (void *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                  (long)local_e8->data);
                sVar8 = local_e8[1].cstep;
                pvVar42 = local_e8[1].data;
                uVar49 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar55 = 0;
                    do {
                      auVar64 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar59 + lVar55),
                                           *(undefined1 (*) [16])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31));
                      *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar64;
                      lVar55 = lVar55 + 0x10;
                    } while ((ulong)uVar54 << 4 != lVar55);
                    pvVar56 = (void *)((long)pvVar56 + lVar55);
                    pvVar59 = (void *)((long)pvVar59 + lVar55);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = local_e8->cstep;
                sVar8 = local_e8->elemsize;
                pvVar42 = local_e8->data;
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           (local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                           (long)local_e8[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar50) {
                    auVar64 = *(undefined1 (*) [16])
                               ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                    uVar54 = uVar50;
                    do {
                      auVar63 = vmaxps_avx(auVar64,*pauVar58);
                      *pauVar53 = auVar63;
                      pauVar58 = pauVar58 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          pOVar36 = (Option *)opt->blob_allocator;
          local_e8 = a;
          if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
            Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar5) {
                sVar7 = local_e8->elemsize;
                pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data
                                  );
                pvVar59 = (void *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                  (long)local_e8[1].data);
                sVar8 = local_e8->cstep;
                pvVar42 = local_e8->data;
                uVar30 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar55 = 0;
                    do {
                      auVar64 = vmaxps_avx(*(undefined1 (*) [16])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31),
                                           *(undefined1 (*) [16])((long)pvVar59 + lVar55));
                      *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar64;
                      lVar55 = lVar55 + 0x10;
                    } while ((ulong)uVar54 << 4 != lVar55);
                    pvVar56 = (void *)((long)pvVar56 + lVar55);
                    pvVar59 = (void *)((long)pvVar59 + lVar55);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar5);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          goto LAB_003d1bce;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar46 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *pauVar46;
                      uVar30 = uVar50;
                      do {
                        auVar63 = vmaxps_avx(auVar64,*pauVar58);
                        *pauVar53 = auVar63;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar46 = pauVar46 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)uVar30) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         ((long)local_e8[1].w * uVar31 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar64 = *pauVar58;
                  uVar50 = uVar54;
                  do {
                    auVar63 = vmaxps_avx(auVar64,*pauVar46);
                    *pauVar53 = auVar63;
                    pauVar46 = pauVar46 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        break;
      case 4:
        pOVar36 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003d1bc6;
        Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           (a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
                pauVar46 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar54) {
                        auVar64 = *pauVar58;
                        uVar50 = uVar54;
                        do {
                          auVar63 = vmaxps_avx(auVar64,*pauVar46);
                          *pauVar53 = auVar63;
                          pauVar46 = pauVar46 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      pauVar58 = pauVar58 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar31 * a[1].elemsize + (long)a[1].data);
                pauVar46 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    auVar64 = *pauVar58;
                    uVar49 = 0;
                    do {
                      uVar50 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          auVar63 = vmaxps_avx(auVar64,*pauVar46);
                          *pauVar53 = auVar63;
                          pauVar46 = pauVar46 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  pauVar58 = pauVar58 + 1;
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          return 0;
        }
        if ((int)local_100 != 1 || a[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = a->data;
              sVar10 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar63 = vmaxps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31));
                *(undefined1 (*) [16])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      goto LAB_003da61c;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      uVar54 = a->w;
      uVar30 = a->h;
      iVar33 = a->d;
      uVar49 = a->c;
      uVar32 = (ulong)uVar49;
      local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
      sVar7 = a->elemsize;
      uVar50 = a[1].w;
      uVar5 = a[1].h;
      iVar4 = a[1].d;
      uVar3 = a[1].c;
      uVar31 = (ulong)uVar3;
      iVar47 = uVar5 * uVar50 * iVar4;
      sVar8 = a[1].elemsize;
      local_e0 = uVar31;
      switch(a->dims) {
      case 1:
        if (iVar29 == 1 && uVar54 == 1) {
LAB_003d0903:
          local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
          local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                             (a,pMVar38,this_00,(Option *)opt->blob_allocator);
          return iVar29;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar53 = (undefined1 (*) [16])this_00->data;
          if (pauVar53 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar58 = (undefined1 (*) [16])a->data;
          pauVar46 = (undefined1 (*) [16])a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar64 = *pauVar58;
              uVar30 = uVar50;
              do {
                auVar63 = vminps_avx(auVar64,*pauVar46);
                *pauVar53 = auVar63;
                pauVar46 = pauVar46 + 1;
                pauVar53 = pauVar53 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar58 = pauVar58 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)a->data + uVar32 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da97c;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar5) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar46 = (undefined1 (*) [16])((long)a->w * uVar32 * a->elemsize + (long)a->data);
              uVar54 = 0;
              do {
                if (0 < (int)uVar50) {
                  auVar64 = *pauVar46;
                  uVar30 = uVar50;
                  do {
                    auVar63 = vminps_avx(auVar64,*pauVar58);
                    *pauVar53 = auVar63;
                    pauVar58 = pauVar58 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                pauVar46 = pauVar46 + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 != uVar5);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar46 = (undefined1 (*) [16])
                         ((long)local_e8->w * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  auVar64 = *pauVar46;
                  uVar54 = 0;
                  do {
                    uVar30 = uVar50;
                    if (0 < (int)uVar50) {
                      do {
                        auVar63 = vminps_avx(auVar64,*pauVar58);
                        *pauVar53 = auVar63;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                pauVar46 = pauVar46 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_e8[1].dims;
        a = local_e8;
        if (iVar29 != 1) goto joined_r0x003d55ff;
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pauVar53 = (undefined1 (*) [16])this_00->data;
        if (pauVar53 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pauVar58 = (undefined1 (*) [16])local_e8->data;
          pauVar46 = (undefined1 (*) [16])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar64 = *pauVar46;
              uVar50 = uVar54;
              do {
                auVar63 = vminps_avx(auVar64,*pauVar58);
                *pauVar53 = auVar63;
                pauVar58 = pauVar58 + 1;
                pauVar53 = pauVar53 + 1;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar46 = pauVar46 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          local_d0 = sVar7;
          if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)local_f8) {
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                auVar64 = *(undefined1 (*) [16])
                           ((long)a[1].data + a[1].cstep * uVar31 * a[1].elemsize);
                pvVar42 = this_00->data;
                sVar10 = a->cstep;
                sVar11 = a->elemsize;
                pvVar56 = a->data;
                lVar55 = 0;
                iVar29 = (int)local_f8;
                do {
                  auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                                ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31))
                  ;
                  *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar63;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          local_d8 = sVar8;
          if (uVar50 == uVar54) {
            if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
              Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar49 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  sVar10 = a->cstep;
                  pvVar42 = this_00->data;
                  pvVar56 = a[1].data;
                  sVar11 = a->elemsize;
                  pvVar59 = a->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar56 + lVar55);
                    auVar63._4_4_ = uVar1;
                    auVar63._0_4_ = uVar1;
                    auVar63._8_4_ = uVar1;
                    auVar63._12_4_ = uVar1;
                    auVar64 = vminps_avx(auVar63,*(undefined1 (*) [16])
                                                  ((long)pvVar59 +
                                                  lVar55 * 4 + sVar10 * sVar11 * uVar31));
                    *(undefined1 (*) [16])((long)pvVar42 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar64;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar32);
              return 0;
            }
            local_f8 = CONCAT44(local_f8._4_4_,iVar47);
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003dad43:
              local_f8 = CONCAT44(local_f8._4_4_,iVar47);
              Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar3 < 1) {
                return 0;
              }
              uVar32 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = a[1].cstep;
                  sVar8 = a[1].elemsize;
                  auVar64 = *(undefined1 (*) [16])((long)a->data + a->cstep * uVar32 * a->elemsize);
                  pvVar42 = a[1].data;
                  sVar10 = this_00->cstep;
                  sVar11 = this_00->elemsize;
                  pvVar56 = this_00->data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                                  ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32))
                    ;
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32) =
                         auVar63;
                    lVar55 = lVar55 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar31);
              return 0;
            }
            if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
              Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_e0 < 1) {
                return 0;
              }
              uVar31 = 0;
              do {
                if (0 < (int)local_f8) {
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar42 = a->data;
                  pvVar56 = this_00->data;
                  sVar10 = a[1].cstep;
                  sVar11 = a[1].elemsize;
                  pvVar59 = a[1].data;
                  lVar55 = 0;
                  iVar29 = (int)local_f8;
                  do {
                    uVar1 = *(undefined4 *)((long)pvVar42 + lVar55);
                    auVar70._4_4_ = uVar1;
                    auVar70._0_4_ = uVar1;
                    auVar70._8_4_ = uVar1;
                    auVar70._12_4_ = uVar1;
                    auVar64 = vminps_avx(auVar70,*(undefined1 (*) [16])
                                                  ((long)pvVar59 +
                                                  lVar55 * 4 + sVar10 * sVar11 * uVar31));
                    *(undefined1 (*) [16])((long)pvVar56 + lVar55 * 4 + sVar7 * sVar8 * uVar31) =
                         auVar64;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 != local_e0);
              return 0;
            }
          }
          else {
            local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003dad43;
          }
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = a[1].cstep;
                sVar8 = a[1].elemsize;
                pvVar42 = a[1].data;
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar54) {
                    auVar64 = *(undefined1 (*) [16])
                               ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                    uVar49 = uVar54;
                    do {
                      auVar63 = vminps_avx(auVar64,*pauVar58);
                      *pauVar53 = auVar63;
                      pauVar58 = pauVar58 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar49 = uVar49 - 1;
                    } while (uVar49 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = local_e8[1].elemsize;
                pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data
                                  );
                pvVar59 = (void *)(local_e8->cstep * uVar31 * local_e8->elemsize +
                                  (long)local_e8->data);
                sVar8 = local_e8[1].cstep;
                pvVar42 = local_e8[1].data;
                uVar49 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar55 = 0;
                    do {
                      auVar64 = vminps_avx(*(undefined1 (*) [16])((long)pvVar59 + lVar55),
                                           *(undefined1 (*) [16])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31));
                      *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar64;
                      lVar55 = lVar55 + 0x10;
                    } while ((ulong)uVar54 << 4 != lVar55);
                    pvVar56 = (void *)((long)pvVar56 + lVar55);
                    pvVar59 = (void *)((long)pvVar59 + lVar55);
                  }
                  uVar49 = uVar49 + 1;
                } while (uVar49 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar30) {
                sVar7 = local_e8->cstep;
                sVar8 = local_e8->elemsize;
                pvVar42 = local_e8->data;
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           (local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                           (long)local_e8[1].data);
                uVar48 = 0;
                do {
                  if (0 < (int)uVar50) {
                    auVar64 = *(undefined1 (*) [16])
                               ((long)pvVar42 + uVar48 * 0x10 + sVar7 * uVar31 * sVar8);
                    uVar54 = uVar50;
                    do {
                      auVar63 = vminps_avx(auVar64,*pauVar58);
                      *pauVar53 = auVar63;
                      pauVar58 = pauVar58 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar54 = uVar54 - 1;
                    } while (uVar54 != 0);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar30);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          pOVar36 = (Option *)opt->blob_allocator;
          local_e8 = a;
          if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
            Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < (int)uVar5) {
                sVar7 = local_e8->elemsize;
                pvVar56 = (void *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data
                                  );
                pvVar59 = (void *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                  (long)local_e8[1].data);
                sVar8 = local_e8->cstep;
                pvVar42 = local_e8->data;
                uVar30 = 0;
                do {
                  if (0 < (int)uVar54) {
                    lVar55 = 0;
                    do {
                      auVar64 = vminps_avx(*(undefined1 (*) [16])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31),
                                           *(undefined1 (*) [16])((long)pvVar59 + lVar55));
                      *(undefined1 (*) [16])((long)pvVar56 + lVar55) = auVar64;
                      lVar55 = lVar55 + 0x10;
                    } while ((ulong)uVar54 << 4 != lVar55);
                    pvVar56 = (void *)((long)pvVar56 + lVar55);
                    pvVar59 = (void *)((long)pvVar59 + lVar55);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar5);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          goto LAB_003d245e;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar4) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar46 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar64 = *pauVar46;
                      uVar30 = uVar50;
                      do {
                        auVar63 = vminps_avx(auVar64,*pauVar58);
                        *pauVar53 = auVar63;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar46 = pauVar46 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)uVar30) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         ((long)local_e8[1].w * uVar31 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pauVar46 = (undefined1 (*) [16])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar64 = *pauVar58;
                  uVar50 = uVar54;
                  do {
                    auVar63 = vminps_avx(auVar64,*pauVar46);
                    *pauVar53 = auVar63;
                    pauVar46 = pauVar46 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar58 = pauVar58 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [16])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        break;
      case 4:
        pOVar36 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003d2456;
        Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           (a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
                pauVar46 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    uVar49 = 0;
                    do {
                      if (0 < (int)uVar54) {
                        auVar64 = *pauVar58;
                        uVar50 = uVar54;
                        do {
                          auVar63 = vminps_avx(auVar64,*pauVar46);
                          *pauVar53 = auVar63;
                          pauVar46 = pauVar46 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      pauVar58 = pauVar58 + 1;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              return 0;
            }
            uVar31 = 0;
            do {
              if (0 < iVar33) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
                pauVar58 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar31 * a[1].elemsize + (long)a[1].data);
                pauVar46 = (undefined1 (*) [16])(a->cstep * uVar31 * a->elemsize + (long)a->data);
                iVar29 = 0;
                do {
                  if (0 < (int)uVar30) {
                    auVar64 = *pauVar58;
                    uVar49 = 0;
                    do {
                      uVar50 = uVar54;
                      if (0 < (int)uVar54) {
                        do {
                          auVar63 = vminps_avx(auVar64,*pauVar46);
                          *pauVar53 = auVar63;
                          pauVar46 = pauVar46 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar50 = uVar50 - 1;
                        } while (uVar50 != 0);
                      }
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar30);
                  }
                  pauVar58 = pauVar58 + 1;
                  iVar29 = iVar29 + 1;
                } while (iVar29 != iVar33);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar32);
            return 0;
          }
          return 0;
        }
        if ((int)local_100 != 1 || a[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = a->cstep;
              sVar8 = a->elemsize;
              auVar64 = *(undefined1 (*) [16])((long)local_108->data + uVar31 * 0x10);
              pvVar42 = a->data;
              sVar10 = this_00->cstep;
              sVar11 = this_00->elemsize;
              pvVar56 = this_00->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar63 = vminps_avx(auVar64,*(undefined1 (*) [16])
                                              ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31));
                *(undefined1 (*) [16])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31) = auVar63;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      goto LAB_003da973;
    case 6:
      if (3 < a->dims - 1U) {
        return 0;
      }
      uVar54 = a->w;
      local_100 = (__m256 *)(ulong)uVar54;
      uVar30 = a->h;
      local_108 = (Mat *)(ulong)uVar30;
      iVar33 = a->d;
      uVar49 = a->c;
      local_d8 = (ulong)uVar49;
      local_e0 = CONCAT44(local_e0._4_4_,uVar30 * uVar54 * iVar33);
      local_68 = a->elemsize;
      local_f0._0_4_ = a[1].w;
      uVar50 = a[1].h;
      iVar4 = a[1].d;
      uVar5 = a[1].c;
      local_d0 = (ulong)uVar5;
      local_110 = (Option *)CONCAT44(local_110._4_4_,uVar50);
      local_f8 = CONCAT44(local_f8._4_4_,iVar4);
      local_c4 = uVar50 * (uint)local_f0 * iVar4;
      sVar7 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar29 != 1 || uVar54 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_003d4482_caseD_1;
          case 2:
            local_e8 = a;
            Mat::create(this_00,(uint)local_f0,uVar50,sVar7,_elempack,opt->blob_allocator);
            puVar40 = (undefined8 *)this_00->data;
            if (puVar40 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)(uint)local_110 < 1) {
              return 0;
            }
            local_108 = (Mat *)local_e8->data;
            pauVar53 = (undefined1 (*) [16])local_e8[1].data;
            local_100 = (__m256 *)((ulong)local_100 & 0xffffffff00000000);
            do {
              afVar28 = local_a0;
              uVar22 = local_108->data;
              uVar23 = local_108->refcount;
              local_a0._8_8_ = uVar23;
              local_a0._0_8_ = uVar22;
              local_a0._16_16_ = afVar28._16_16_;
              uVar54 = (uint)local_f0;
              if (0 < (int)(uint)local_f0) {
                do {
                  uVar94 = *(undefined8 *)((long)*pauVar53 + 8);
                  local_c0._0_16_ = *pauVar53;
                  afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                      (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                  *puVar40 = afVar98._0_8_;
                  puVar40[1] = uVar94;
                  pauVar53 = pauVar53 + 1;
                  puVar40 = puVar40 + 2;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 0x10);
              iVar29 = (int)local_100 + 1;
              local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar29);
            } while (iVar29 != (uint)local_110);
            return 0;
          case 3:
            local_e8 = a;
            Mat::create(this_00,(uint)local_f0,uVar50,uVar5,sVar7,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d0 < 1) {
              return 0;
            }
            local_108 = (Mat *)0x0;
            do {
              local_a0._0_16_ =
                   *(undefined1 (*) [16])((long)local_e8->data + (long)local_108 * 0x10);
              if (0 < local_c4) {
                local_110 = (Option *)
                            (this_00->cstep * this_00->elemsize * (long)local_108 +
                            (long)this_00->data);
                local_f0 = (__m256 *)
                           (local_e8[1].cstep * local_e8[1].elemsize * (long)local_108 +
                           (long)local_e8[1].data);
                lVar55 = 0;
                iVar29 = local_c4;
                do {
                  uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_f0 + lVar55) + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + lVar55);
                  afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                      (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                  *(undefined8 *)((long)local_110 + lVar55) = afVar98._0_8_;
                  ((undefined8 *)((long)local_110 + lVar55))[1] = uVar94;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 1);
            } while (local_108 != (Mat *)local_d0);
            return 0;
          case 4:
            local_e8 = a;
            Mat::create(this_00,(uint)local_f0,uVar50,iVar4,uVar5,sVar7,_elempack,
                        opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d0 < 1) {
              return 0;
            }
            local_108 = (Mat *)0x0;
            do {
              local_a0._0_16_ =
                   *(undefined1 (*) [16])((long)local_e8->data + (long)local_108 * 0x10);
              if (0 < local_c4) {
                local_110 = (Option *)
                            (this_00->cstep * this_00->elemsize * (long)local_108 +
                            (long)this_00->data);
                local_f0 = (__m256 *)
                           (local_e8[1].cstep * local_e8[1].elemsize * (long)local_108 +
                           (long)local_e8[1].data);
                lVar55 = 0;
                iVar29 = local_c4;
                do {
                  uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_f0 + lVar55) + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + lVar55);
                  afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                      (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                  *(undefined8 *)((long)local_110 + lVar55) = afVar98._0_8_;
                  ((undefined8 *)((long)local_110 + lVar55))[1] = uVar94;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 1);
            } while (local_108 != (Mat *)local_d0);
            return 0;
          default:
            return 0;
          }
        }
LAB_003d09bf:
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                           (a,pMVar38,this_00,(Option *)opt->blob_allocator);
        return iVar29;
      case 2:
        pAVar9 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_e8 = a;
          Mat::create(this_00,(uint)local_f0,uVar50,uVar5,sVar7,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d0 < 1) {
            return 0;
          }
          local_f8 = 0;
          do {
            if (0 < (int)(uint)local_110) {
              pauVar58 = (undefined1 (*) [16])
                         (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
              pauVar53 = (undefined1 (*) [16])
                         (local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              local_108 = (Mat *)((long)local_e8->w * local_f8 * local_e8->elemsize +
                                 (long)local_e8->data);
              iVar29 = 0;
              do {
                local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar29);
                local_a0._0_16_ = *(undefined1 (*) [16])local_108;
                uVar54 = (uint)local_f0;
                if (0 < (int)(uint)local_f0) {
                  do {
                    auVar95 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                    local_c0._0_16_ = *pauVar53;
                    afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                        (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                    auVar84._0_8_ = afVar98._0_8_;
                    auVar84._8_56_ = auVar95;
                    *pauVar58 = auVar84._0_16_;
                    pauVar53 = pauVar53 + 1;
                    pauVar58 = pauVar58 + 1;
                    uVar54 = uVar54 - 1;
                  } while (uVar54 != 0);
                }
                local_108 = (Mat *)((long)local_108 + 0x10);
                iVar29 = (int)local_100 + 1;
              } while (iVar29 != (uint)local_110);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != local_d0);
          return 0;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,(uint)local_f0,uVar50,iVar4,uVar5,sVar7,_elempack,pAVar9);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d0 < 1) {
            return 0;
          }
          local_d8 = 0;
          do {
            if (0 < (int)local_f8) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * local_d8 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              local_100 = (__m256 *)
                          ((long)local_e8->w * local_d8 * local_e8->elemsize + (long)local_e8->data)
              ;
              iVar29 = 0;
              do {
                local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                local_a0._0_16_ = *(undefined1 (*) [16])local_100;
                if (0 < (int)(uint)local_110) {
                  iVar29 = 0;
                  do {
                    local_108 = (Mat *)CONCAT44(local_108._4_4_,iVar29);
                    uVar54 = (uint)local_f0;
                    if (0 < (int)(uint)local_f0) {
                      do {
                        auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                        local_c0._0_16_ = *pauVar58;
                        afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                            (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar82._0_8_ = afVar98._0_8_;
                        auVar82._8_56_ = auVar95;
                        *pauVar53 = auVar82._0_16_;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    iVar29 = (int)local_108 + 1;
                  } while (iVar29 != (uint)local_110);
                }
                local_100 = (__m256 *)((long)local_100 + 0x10);
                iVar29 = (int)local_e0 + 1;
              } while (iVar29 != (int)local_f8);
            }
            local_d8 = local_d8 + 1;
          } while (local_d8 != local_d0);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,local_68,iVar29,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims == 1) {
          Mat::create(this_00,(int)local_100,(int)local_108,local_68,iVar29,opt->blob_allocator);
          puVar40 = (undefined8 *)this_00->data;
          if (puVar40 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (_elempack != 1 || local_e8[1].w != 1) {
            if ((int)local_108 < 1) {
              return 0;
            }
            pauVar53 = (undefined1 (*) [16])local_e8->data;
            local_110 = (Option *)local_e8[1].data;
            local_f0 = (__m256 *)((ulong)local_f0._4_4_ << 0x20);
            do {
              afVar28 = local_a0;
              uVar24 = local_110->lightmode;
              uVar25 = *(undefined3 *)&local_110->field_0x1;
              uVar26 = local_110->num_threads;
              uVar27 = local_110->blob_allocator;
              local_a0._8_8_ = uVar27;
              local_a0[1] = (float)uVar26;
              local_a0[0]._1_3_ = uVar25;
              local_a0[0]._0_1_ = uVar24;
              local_a0._16_16_ = afVar28._16_16_;
              uVar31 = (ulong)local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  uVar94 = *(undefined8 *)((long)*pauVar53 + 8);
                  local_c0._0_16_ = *pauVar53;
                  afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                      (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                  *puVar40 = afVar98._0_8_;
                  puVar40[1] = uVar94;
                  pauVar53 = pauVar53 + 1;
                  puVar40 = puVar40 + 2;
                  uVar54 = (int)uVar31 - 1;
                  uVar31 = (ulong)uVar54;
                } while (uVar54 != 0);
              }
              local_110 = (Option *)((long)local_110 + 0x10);
              iVar29 = (uint)local_f0 + 1;
              local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
            } while (iVar29 != (int)local_108);
            return 0;
          }
          pOVar36 = (Option *)opt->blob_allocator;
          goto LAB_003da8fc;
        }
        if (local_e8[1].dims != 2) {
          return 0;
        }
        pOVar36 = (Option *)opt->blob_allocator;
        a = local_e8;
LAB_003d2486:
        iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                           (a,pMVar38,this_00,pOVar36);
        return iVar29;
      case 3:
        if (a[1].dims == 3) {
          local_5c = (uint)local_f0 ^ 1;
          local_f8 = CONCAT44(local_f8._4_4_,uVar50) ^ 1;
          if (uVar5 == uVar49 && (local_5c == 0 && uVar50 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,local_68,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d8 < 1) {
              return 0;
            }
            local_108 = (Mat *)0x0;
            do {
              local_a0._0_16_ =
                   *(undefined1 (*) [16])
                    ((long)local_e8[1].data +
                    local_e8[1].cstep * (long)local_108 * local_e8[1].elemsize);
              if (0 < (int)local_e0) {
                local_f0 = (__m256 *)
                           ((long)this_00->data +
                           this_00->cstep * this_00->elemsize * (long)local_108);
                local_110 = (Option *)
                            ((long)local_e8->data +
                            local_e8->cstep * local_e8->elemsize * (long)local_108);
                lVar55 = 0;
                iVar29 = (int)local_e0;
                do {
                  uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_110 + lVar55) + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])((long)local_110 + lVar55);
                  afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                      (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                  *(undefined8 *)((long)local_f0 + lVar55) = afVar98._0_8_;
                  ((undefined8 *)((long)local_f0 + lVar55))[1] = uVar94;
                  lVar55 = lVar55 + 0x10;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 1);
            } while (local_108 != (Mat *)local_d8);
            return 0;
          }
          if ((uint)local_f0 == uVar54) {
            if (_elempack == 1 && (uVar5 == 1 && uVar50 == uVar30)) {
              local_e8 = a;
              Mat::create(this_00,uVar54,uVar30,uVar49,local_68,iVar29,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_d8 < 1) {
                return 0;
              }
              local_100 = (__m256 *)0x0;
              do {
                if (0 < (int)local_e0) {
                  local_110 = (Option *)
                              (this_00->cstep * this_00->elemsize * (long)local_100 +
                              (long)this_00->data);
                  local_108 = (Mat *)local_e8[1].data;
                  local_f0 = (__m256 *)
                             (local_e8->cstep * local_e8->elemsize * (long)local_100 +
                             (long)local_e8->data);
                  lVar55 = 0;
                  iVar29 = (int)local_e0;
                  do {
                    local_a0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + lVar55 * 4);
                    uVar1 = *(undefined4 *)((long)local_108 + lVar55);
                    auVar64._4_4_ = uVar1;
                    auVar64._0_4_ = uVar1;
                    auVar64._8_4_ = uVar1;
                    auVar64._12_4_ = uVar1;
                    auVar95 = ZEXT856(auVar64._8_8_);
                    local_c0[0] = (float)uVar1;
                    local_c0[1] = (float)uVar1;
                    local_c0[2] = (float)uVar1;
                    local_c0[3] = (float)uVar1;
                    afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                        (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                    auVar86._0_8_ = afVar98._0_8_;
                    auVar86._8_56_ = auVar95;
                    *(undefined1 (*) [16])((long)local_110 + lVar55 * 4) = auVar86._0_16_;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                local_100 = (__m256 *)((long)local_100 + 1);
              } while (local_100 != (__m256 *)local_d8);
              return 0;
            }
            local_e0 = CONCAT71(local_e0._1_7_,uVar54 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar5 == uVar49) {
LAB_003dae3a:
              local_e8 = a;
              Mat::create(this_00,(uint)local_f0,uVar50,uVar5,sVar7,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_d0 < 1) {
                return 0;
              }
              local_108 = (Mat *)0x0;
              do {
                local_a0._0_16_ =
                     *(undefined1 (*) [16])
                      ((long)local_e8->data + local_e8->cstep * (long)local_108 * local_e8->elemsize
                      );
                if (0 < local_c4) {
                  local_f0 = (__m256 *)
                             ((long)local_e8[1].data +
                             local_e8[1].cstep * local_e8[1].elemsize * (long)local_108);
                  local_110 = (Option *)
                              ((long)this_00->data +
                              this_00->cstep * this_00->elemsize * (long)local_108);
                  lVar55 = 0;
                  iVar29 = local_c4;
                  do {
                    uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_f0 + lVar55) + 8);
                    local_c0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + lVar55);
                    afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                        (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                    *(undefined8 *)((long)local_110 + lVar55) = afVar98._0_8_;
                    ((undefined8 *)((long)local_110 + lVar55))[1] = uVar94;
                    lVar55 = lVar55 + 0x10;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                local_108 = (Mat *)((long)local_108 + 1);
              } while (local_108 != (Mat *)local_d0);
              return 0;
            }
            if (iVar29 == 1 && (uVar49 == 1 && uVar50 == uVar30)) {
              local_e8 = a;
              Mat::create(this_00,uVar54,uVar30,uVar5,sVar7,_elempack,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_d0 < 1) {
                return 0;
              }
              local_100 = (__m256 *)0x0;
              do {
                if (0 < local_c4) {
                  local_f0 = (__m256 *)local_e8->data;
                  local_110 = (Option *)
                              (this_00->cstep * this_00->elemsize * (long)local_100 +
                              (long)this_00->data);
                  local_108 = (Mat *)(local_e8[1].cstep * local_e8[1].elemsize * (long)local_100 +
                                     (long)local_e8[1].data);
                  lVar55 = 0;
                  iVar29 = local_c4;
                  do {
                    afVar28 = local_a0;
                    local_a0[1] = *(float *)((long)local_f0 + lVar55);
                    local_a0[0] = local_a0[1];
                    local_a0[2] = local_a0[1];
                    local_a0._16_16_ = afVar28._16_16_;
                    local_a0[3] = local_a0[1];
                    pauVar53 = (undefined1 (*) [16])((long)local_108 + lVar55 * 4);
                    auVar95 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                    local_c0._0_16_ = *pauVar53;
                    afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                        (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                    auVar90._0_8_ = afVar98._0_8_;
                    auVar90._8_56_ = auVar95;
                    *(undefined1 (*) [16])((long)local_110 + lVar55 * 4) = auVar90._0_16_;
                    lVar55 = lVar55 + 4;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                local_100 = (__m256 *)((long)local_100 + 1);
              } while (local_100 != (__m256 *)local_d0);
              return 0;
            }
          }
          else {
            local_e0 = CONCAT71(local_e0._1_7_,uVar54 == 1);
            if ((uVar54 == 1 && uVar30 == 1) && uVar5 == uVar49) goto LAB_003dae3a;
          }
          local_c4._1_3_ = (undefined3)((uint)local_c4 >> 8);
          local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
          if (((local_5c == 0 && uVar50 == uVar30) && uVar49 == uVar5) && uVar54 != 1) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,local_68,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d8 < 1) {
              return 0;
            }
            local_f8 = 0;
            do {
              if (0 < (int)local_108) {
                local_f0 = (__m256 *)
                           (local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                           (long)local_e8[1].data);
                pauVar58 = (undefined1 (*) [16])
                           (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
                pauVar53 = (undefined1 (*) [16])
                           (local_e8->cstep * local_f8 * local_e8->elemsize + (long)local_e8->data);
                local_110 = (Option *)0x0;
                do {
                  local_a0._0_16_ = *(undefined1 (*) [16])((long)local_f0 + (long)local_110 * 0x10);
                  uVar31 = (ulong)local_100 & 0xffffffff;
                  if (0 < (int)local_100) {
                    do {
                      auVar95 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                      local_c0._0_16_ = *pauVar53;
                      afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                          (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                      auVar87._0_8_ = afVar98._0_8_;
                      auVar87._8_56_ = auVar95;
                      *pauVar58 = auVar87._0_16_;
                      pauVar53 = pauVar53 + 1;
                      pauVar58 = pauVar58 + 1;
                      uVar54 = (int)uVar31 - 1;
                      uVar31 = (ulong)uVar54;
                    } while (uVar54 != 0);
                  }
                  local_110 = (Option *)((long)local_110 + 1);
                } while ((Mat *)local_110 != local_108);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_d8);
            return 0;
          }
          if ((((uint)local_f0 == uVar54 && (int)local_f8 == 0) && uVar49 == uVar5) && uVar30 != 1)
          {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,local_68,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d8 < 1) {
              return 0;
            }
            lVar55 = (long)local_100 << 4;
            local_f8 = 0;
            local_f0 = (__m256 *)lVar55;
            do {
              if (0 < (int)local_108) {
                pvVar59 = (void *)(this_00->cstep * local_f8 * this_00->elemsize +
                                  (long)this_00->data);
                pvVar56 = (void *)(local_e8->cstep * local_f8 * local_e8->elemsize +
                                  (long)local_e8->data);
                lVar41 = local_e8[1].elemsize * local_e8[1].cstep * local_f8;
                pvVar42 = local_e8[1].data;
                iVar29 = 0;
                pafVar39 = local_100;
                pMVar38 = local_108;
                do {
                  if (0 < (int)pafVar39) {
                    local_110 = (Option *)CONCAT44(local_110._4_4_,iVar29);
                    lVar51 = 0;
                    do {
                      local_a0._0_16_ = *(undefined1 (*) [16])((long)pvVar56 + lVar51);
                      pauVar53 = (undefined1 (*) [16])((long)pvVar42 + lVar51 + lVar41);
                      auVar95 = ZEXT856(*(ulong *)(*pauVar53 + 8));
                      local_c0._0_16_ = *pauVar53;
                      afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                          (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                      auVar89._0_8_ = afVar98._0_8_;
                      auVar89._8_56_ = auVar95;
                      *(undefined1 (*) [16])((long)pvVar59 + lVar51) = auVar89._0_16_;
                      lVar51 = lVar51 + 0x10;
                    } while (lVar55 != lVar51);
                    pvVar59 = (void *)((long)pvVar59 + lVar51);
                    pvVar56 = (void *)((long)pvVar56 + lVar51);
                    pafVar39 = local_100;
                    pMVar38 = local_108;
                    iVar29 = (uint)local_110;
                  }
                  iVar29 = iVar29 + 1;
                } while (iVar29 != (int)pMVar38);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_d8);
            return 0;
          }
          if (((uVar5 == uVar49 && uVar50 == uVar30) & (uint)local_f0 != 1 & (byte)local_e0) == 1) {
            local_e8 = a;
            Mat::create(this_00,(uint)local_f0,uVar30,uVar49,sVar7,_elempack,opt->blob_allocator);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_d8 < 1) {
                return 0;
              }
              local_f8 = 0;
              do {
                if (0 < (int)local_108) {
                  local_100 = (__m256 *)
                              (local_e8->cstep * local_f8 * local_e8->elemsize +
                              (long)local_e8->data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
                  pauVar58 = (undefined1 (*) [16])
                             (local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                             (long)local_e8[1].data);
                  local_110 = (Option *)0x0;
                  do {
                    local_a0._0_16_ =
                         *(undefined1 (*) [16])((long)local_100 + (long)local_110 * 0x10);
                    uVar54 = (uint)local_f0;
                    if (0 < (int)(uint)local_f0) {
                      do {
                        auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                        local_c0._0_16_ = *pauVar58;
                        afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                            (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar91._0_8_ = afVar98._0_8_;
                        auVar91._8_56_ = auVar95;
                        *pauVar53 = auVar91._0_16_;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    local_110 = (Option *)((long)local_110 + 1);
                  } while ((Mat *)local_110 != local_108);
                }
                local_f8 = local_f8 + 1;
              } while (local_f8 != local_d8);
              return 0;
            }
          }
          else {
            pOVar36 = (Option *)opt->blob_allocator;
            local_e8 = a;
            if ((uVar30 != 1 || uVar5 != uVar49) || (uVar50 == 1 || (uint)local_f0 != uVar54))
            goto LAB_003d2486;
            Mat::create(this_00,uVar54,uVar50,uVar49,sVar7,_elempack,(Allocator *)pOVar36);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_d8 < 1) {
                return 0;
              }
              lVar55 = (long)local_100 << 4;
              local_e0 = 0;
              local_f8 = lVar55;
              do {
                uVar31 = local_d8;
                if (0 < (int)(uint)local_110) {
                  pvVar42 = (void *)(this_00->cstep * local_e0 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar56 = (void *)(local_e8[1].cstep * local_e0 * local_e8[1].elemsize +
                                    (long)local_e8[1].data);
                  local_108 = (Mat *)(local_e8->elemsize * local_e8->cstep * local_e0 +
                                     (long)local_e8->data);
                  local_f0._0_4_ = 0;
                  pafVar39 = local_100;
                  do {
                    pMVar38 = local_108;
                    if (0 < (int)pafVar39) {
                      lVar41 = 0;
                      do {
                        local_a0._0_16_ = *(undefined1 (*) [16])((long)pMVar38 + lVar41);
                        auVar95 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)pvVar56 + lVar41)
                                                    + 8));
                        local_c0._0_16_ = *(undefined1 (*) [16])((long)pvVar56 + lVar41);
                        afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                            (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar92._0_8_ = afVar98._0_8_;
                        auVar92._8_56_ = auVar95;
                        *(undefined1 (*) [16])((long)pvVar42 + lVar41) = auVar92._0_16_;
                        lVar41 = lVar41 + 0x10;
                      } while (lVar55 != lVar41);
                      pvVar42 = (void *)((long)pvVar42 + lVar41);
                      pvVar56 = (void *)((long)pvVar56 + lVar41);
                      uVar31 = local_d8;
                      pafVar39 = local_100;
                    }
                    local_f0._0_4_ = (uint)local_f0 + 1;
                  } while ((uint)local_f0 != (uint)local_110);
                }
                local_e0 = local_e0 + 1;
              } while (local_e0 != uVar31);
              return 0;
            }
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,(uint)local_f0,uVar50,iVar4,uVar5,sVar7,_elempack,opt->blob_allocator)
          ;
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d0 < 1) {
            return 0;
          }
          local_d8 = 0;
          do {
            if (0 < (int)local_f8) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8[1].cstep * local_d8 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              local_108 = (Mat *)(local_e8->cstep * local_d8 * local_e8->elemsize +
                                 (long)local_e8->data);
              iVar29 = 0;
              do {
                local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                if (0 < (int)(uint)local_110) {
                  iVar29 = 0;
                  do {
                    local_100 = (__m256 *)CONCAT44(local_100._4_4_,iVar29);
                    local_a0._0_16_ = *(undefined1 (*) [16])local_108;
                    uVar54 = (uint)local_f0;
                    if (0 < (int)(uint)local_f0) {
                      do {
                        auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                        local_c0._0_16_ = *pauVar58;
                        afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                            (&local_111,(__m128 *)local_a0,(__m128 *)local_c0);
                        auVar81._0_8_ = afVar98._0_8_;
                        auVar81._8_56_ = auVar95;
                        *pauVar53 = auVar81._0_16_;
                        pauVar58 = pauVar58 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar54 = uVar54 - 1;
                      } while (uVar54 != 0);
                    }
                    local_108 = (Mat *)((long)local_108 + 0x10);
                    iVar29 = (int)local_100 + 1;
                  } while (iVar29 != (uint)local_110);
                }
                iVar29 = (int)local_e0 + 1;
              } while (iVar29 != (int)local_f8);
            }
            local_d8 = local_d8 + 1;
          } while (local_d8 != local_d0);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,local_68,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          local_f8 = 0;
          do {
            if (0 < (int)local_108) {
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
              local_110 = (Option *)
                          ((long)local_e8[1].w * local_f8 * local_e8[1].elemsize +
                          (long)local_e8[1].data);
              pauVar58 = (undefined1 (*) [16])
                         (local_e8->cstep * local_f8 * local_e8->elemsize + (long)local_e8->data);
              local_f0._0_4_ = 0;
              do {
                local_a0._0_16_ = local_110->lightmode;
                uVar31 = (ulong)local_100 & 0xffffffff;
                if (0 < (int)local_100) {
                  do {
                    auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                    local_c0._0_16_ = *pauVar58;
                    afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                        (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                    auVar85._0_8_ = afVar98._0_8_;
                    auVar85._8_56_ = auVar95;
                    *pauVar53 = auVar85._0_16_;
                    pauVar58 = pauVar58 + 1;
                    pauVar53 = pauVar53 + 1;
                    uVar54 = (int)uVar31 - 1;
                    uVar31 = (ulong)uVar54;
                  } while (uVar54 != 0);
                }
                local_110 = (Option *)((long)local_110 + 0x10);
                local_f0._0_4_ = (uint)local_f0 + 1;
              } while ((uint)local_f0 != (int)local_108);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != local_d8);
          return 0;
        }
        if (_elempack != 1 || local_e8[1].w != 1) {
          if ((int)local_d8 < 1) {
            return 0;
          }
          local_108 = (Mat *)0x0;
          do {
            local_a0._0_16_ =
                 *(undefined1 (*) [16])((long)local_e8[1].data + (long)local_108 * 0x10);
            if (0 < (int)local_e0) {
              local_f0 = (__m256 *)
                         (this_00->cstep * this_00->elemsize * (long)local_108 + (long)this_00->data
                         );
              local_110 = (Option *)
                          ((long)local_e8->data +
                          local_e8->cstep * local_e8->elemsize * (long)local_108);
              lVar55 = 0;
              iVar29 = (int)local_e0;
              do {
                uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_110 + lVar55) + 8);
                local_c0._0_16_ = *(undefined1 (*) [16])((long)local_110 + lVar55);
                afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                    (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                *(undefined8 *)((long)local_f0 + lVar55) = afVar98._0_8_;
                ((undefined8 *)((long)local_f0 + lVar55))[1] = uVar94;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 1);
          } while (local_108 != (Mat *)local_d8);
          return 0;
        }
        break;
      case 4:
        local_f8 = CONCAT44(local_f8._4_4_,iVar33);
        pOVar36 = (Option *)opt->blob_allocator;
        if (a[1].dims == 4) goto LAB_003d2486;
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,local_68,iVar29,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_e8[1].dims;
        iVar33 = (int)local_d8;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if (iVar33 < 1) {
              return 0;
            }
            local_d0 = 0;
            do {
              if (0 < (int)local_f8) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * local_d0 * this_00->elemsize + (long)this_00->data);
                local_110 = (Option *)
                            (local_e8[1].cstep * local_d0 * local_e8[1].elemsize +
                            (long)local_e8[1].data);
                pauVar58 = (undefined1 (*) [16])
                           (local_e8->cstep * local_d0 * local_e8->elemsize + (long)local_e8->data);
                iVar29 = 0;
                pafVar39 = local_100;
                pMVar38 = local_108;
                do {
                  local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                  if (0 < (int)pMVar38) {
                    local_f0._0_4_ = 0;
                    do {
                      local_a0._0_16_ = local_110->lightmode;
                      uVar31 = (ulong)pafVar39 & 0xffffffff;
                      if (0 < (int)pafVar39) {
                        do {
                          auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                          local_c0._0_16_ = *pauVar58;
                          afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                              (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                          auVar88._0_8_ = afVar98._0_8_;
                          auVar88._8_56_ = auVar95;
                          *pauVar53 = auVar88._0_16_;
                          pauVar58 = pauVar58 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar54 = (int)uVar31 - 1;
                          uVar31 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      local_110 = (Option *)((long)local_110 + 0x10);
                      local_f0._0_4_ = (uint)local_f0 + 1;
                      pafVar39 = local_100;
                      pMVar38 = local_108;
                    } while ((uint)local_f0 != (int)local_108);
                  }
                  iVar29 = (int)local_e0 + 1;
                } while (iVar29 != (int)local_f8);
              }
              local_d0 = local_d0 + 1;
            } while (local_d0 != local_d8);
            return 0;
          }
          if (iVar29 == 2) {
            if (iVar33 < 1) {
              return 0;
            }
            local_d0 = 0;
            do {
              if (0 < (int)local_f8) {
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * local_d0 * this_00->elemsize + (long)this_00->data);
                local_f0 = (__m256 *)
                           ((long)local_e8[1].w * local_d0 * local_e8[1].elemsize +
                           (long)local_e8[1].data);
                pauVar58 = (undefined1 (*) [16])
                           (local_e8->cstep * local_d0 * local_e8->elemsize + (long)local_e8->data);
                iVar29 = 0;
                pafVar39 = local_100;
                pMVar38 = local_108;
                do {
                  local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                  local_a0._0_16_ = *(undefined1 (*) [16])local_f0;
                  if (0 < (int)pMVar38) {
                    iVar29 = 0;
                    do {
                      local_110 = (Option *)CONCAT44(local_110._4_4_,iVar29);
                      uVar31 = (ulong)pafVar39 & 0xffffffff;
                      if (0 < (int)pafVar39) {
                        do {
                          auVar95 = ZEXT856(*(ulong *)((long)*pauVar58 + 8));
                          local_c0._0_16_ = *pauVar58;
                          afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                              (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                          auVar83._0_8_ = afVar98._0_8_;
                          auVar83._8_56_ = auVar95;
                          *pauVar53 = auVar83._0_16_;
                          pauVar58 = pauVar58 + 1;
                          pauVar53 = pauVar53 + 1;
                          uVar54 = (int)uVar31 - 1;
                          uVar31 = (ulong)uVar54;
                        } while (uVar54 != 0);
                      }
                      iVar29 = (uint)local_110 + 1;
                      pafVar39 = local_100;
                      pMVar38 = local_108;
                    } while (iVar29 != (int)local_108);
                  }
                  local_f0 = (__m256 *)((long)local_f0 + 0x10);
                  iVar29 = (int)local_e0 + 1;
                } while (iVar29 != (int)local_f8);
              }
              local_d0 = local_d0 + 1;
            } while (local_d0 != local_d8);
            return 0;
          }
          return 0;
        }
        if (_elempack != 1 || local_e8[1].w != 1) {
          if (iVar33 < 1) {
            return 0;
          }
          local_108 = (Mat *)0x0;
          do {
            local_a0._0_16_ =
                 *(undefined1 (*) [16])((long)local_e8[1].data + (long)local_108 * 0x10);
            if (0 < (int)local_e0) {
              local_110 = (Option *)
                          ((long)local_e8->data +
                          local_e8->cstep * local_e8->elemsize * (long)local_108);
              local_f0 = (__m256 *)
                         (this_00->cstep * this_00->elemsize * (long)local_108 + (long)this_00->data
                         );
              lVar55 = 0;
              iVar29 = (int)local_e0;
              do {
                uVar94 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_110 + lVar55) + 8);
                local_c0._0_16_ = *(undefined1 (*) [16])((long)local_110 + lVar55);
                afVar98 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                    (&local_111,(__m128 *)local_c0,(__m128 *)local_a0);
                *(undefined8 *)((long)local_f0 + lVar55) = afVar98._0_8_;
                ((undefined8 *)((long)local_f0 + lVar55))[1] = uVar94;
                lVar55 = lVar55 + 0x10;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 1);
          } while (local_108 != (Mat *)local_d8);
          return 0;
        }
      }
      goto LAB_003da8f7;
    case 7:
      pMVar43 = a;
      a = pMVar38;
      break;
    case 8:
      pMVar43 = a;
      a = pMVar38;
LAB_003d09dd:
      iVar29 = binary_op_pack4<ncnn::BinaryOp_x86_fma_functor::binary_op_div>(a,pMVar43,this_00,opt)
      ;
      return iVar29;
    default:
      goto switchD_003d0136_default;
    }
    iVar29 = binary_op_pack4<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>(a,pMVar43,this_00,opt);
    return iVar29;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
    uVar54 = a->w;
    uVar30 = a->h;
    iVar33 = a->d;
    uVar49 = a->c;
    uVar31 = (ulong)uVar49;
    local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
    sVar7 = a->elemsize;
    uVar50 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar32 = (ulong)uVar3;
    iVar47 = uVar5 * uVar50 * iVar4;
    sVar8 = a[1].elemsize;
    local_e0 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar34 = (float *)this_00->data;
          if (pfVar34 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar35 = (undefined1 (*) [32])a->data;
          pfVar44 = (float *)a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar75 = *pauVar35;
              uVar30 = uVar50;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                fVar18 = pfVar44[4];
                fVar19 = pfVar44[5];
                fVar20 = pfVar44[6];
                fVar21 = pfVar44[7];
                *pfVar34 = auVar75._0_4_ + *pfVar44;
                pfVar34[1] = auVar75._4_4_ + fVar2;
                pfVar34[2] = auVar75._8_4_ + fVar16;
                pfVar34[3] = auVar75._12_4_ + fVar17;
                pfVar34[4] = auVar75._16_4_ + fVar18;
                pfVar34[5] = auVar75._20_4_ + fVar19;
                pfVar34[6] = auVar75._24_4_ + fVar20;
                pfVar34[7] = auVar75._28_4_ + fVar21;
                pfVar44 = pfVar44 + 8;
                pfVar34 = pfVar34 + 8;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar35 = pauVar35 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                fVar21 = pfVar34[7];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ + *pfVar34;
                pfVar44[1] = auVar75._4_4_ + fVar2;
                pfVar44[2] = auVar75._8_4_ + fVar16;
                pfVar44[3] = auVar75._12_4_ + fVar17;
                pfVar44[4] = auVar75._16_4_ + fVar18;
                pfVar44[5] = auVar75._20_4_ + fVar19;
                pfVar44[6] = auVar75._24_4_ + fVar20;
                pfVar44[7] = auVar75._28_4_ + fVar21;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                fVar21 = pfVar34[7];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ + *pfVar34;
                pfVar44[1] = auVar75._4_4_ + fVar2;
                pfVar44[2] = auVar75._8_4_ + fVar16;
                pfVar44[3] = auVar75._12_4_ + fVar17;
                pfVar44[4] = auVar75._16_4_ + fVar18;
                pfVar44[5] = auVar75._20_4_ + fVar19;
                pfVar44[6] = auVar75._24_4_ + fVar20;
                pfVar44[7] = auVar75._28_4_ + fVar21;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da8d0;
      }
      goto LAB_003d01c8;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < (int)uVar5) {
            pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
            pauVar35 = (undefined1 (*) [32])((long)a->w * uVar31 * a->elemsize + (long)a->data);
            uVar54 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *pauVar35;
                uVar30 = uVar50;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  fVar21 = pfVar44[7];
                  *pfVar34 = auVar75._0_4_ + *pfVar44;
                  pfVar34[1] = auVar75._4_4_ + fVar2;
                  pfVar34[2] = auVar75._8_4_ + fVar16;
                  pfVar34[3] = auVar75._12_4_ + fVar17;
                  pfVar34[4] = auVar75._16_4_ + fVar18;
                  pfVar34[5] = auVar75._20_4_ + fVar19;
                  pfVar34[6] = auVar75._24_4_ + fVar20;
                  pfVar34[7] = auVar75._28_4_ + fVar21;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar30 = uVar30 - 1;
                } while (uVar30 != 0);
              }
              pauVar35 = pauVar35 + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar5);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar4) {
            pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                               (long)local_e8[1].data);
            pauVar35 = (undefined1 (*) [32])
                       ((long)local_e8->w * uVar31 * local_e8->elemsize + (long)local_e8->data);
            iVar29 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar75 = *pauVar35;
                uVar54 = 0;
                do {
                  uVar30 = uVar50;
                  if (0 < (int)uVar50) {
                    do {
                      fVar2 = pfVar44[1];
                      fVar16 = pfVar44[2];
                      fVar17 = pfVar44[3];
                      fVar18 = pfVar44[4];
                      fVar19 = pfVar44[5];
                      fVar20 = pfVar44[6];
                      fVar21 = pfVar44[7];
                      *pfVar34 = auVar75._0_4_ + *pfVar44;
                      pfVar34[1] = auVar75._4_4_ + fVar2;
                      pfVar34[2] = auVar75._8_4_ + fVar16;
                      pfVar34[3] = auVar75._12_4_ + fVar17;
                      pfVar34[4] = auVar75._16_4_ + fVar18;
                      pfVar34[5] = auVar75._20_4_ + fVar19;
                      pfVar34[6] = auVar75._24_4_ + fVar20;
                      pfVar34[7] = auVar75._28_4_ + fVar21;
                      pfVar44 = pfVar44 + 8;
                      pfVar34 = pfVar34 + 8;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar5);
              }
              pauVar35 = pauVar35 + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar4);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_e8[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pfVar34 = (float *)this_00->data;
        if (pfVar34 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pfVar44 = (float *)local_e8->data;
          pauVar35 = (undefined1 (*) [32])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar75 = *pauVar35;
              uVar50 = uVar54;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                fVar18 = pfVar44[4];
                fVar19 = pfVar44[5];
                fVar20 = pfVar44[6];
                fVar21 = pfVar44[7];
                *pfVar34 = auVar75._0_4_ + *pfVar44;
                pfVar34[1] = auVar75._4_4_ + fVar2;
                pfVar34[2] = auVar75._8_4_ + fVar16;
                pfVar34[3] = auVar75._12_4_ + fVar17;
                pfVar34[4] = auVar75._16_4_ + fVar18;
                pfVar34[5] = auVar75._20_4_ + fVar19;
                pfVar34[6] = auVar75._24_4_ + fVar20;
                pfVar34[7] = auVar75._28_4_ + fVar21;
                pfVar44 = pfVar44 + 8;
                pfVar34 = pfVar34 + 8;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar35 = pauVar35 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      }
LAB_003d541b:
      if (iVar29 != 2) {
        return 0;
      }
      pOVar36 = (Option *)local_110->blob_allocator;
      a = local_e8;
LAB_003d207c:
      iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                         (a,local_108,this_00,pOVar36);
      return iVar29;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar35 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar75 = *pauVar35;
                      uVar30 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        fVar21 = pfVar44[7];
                        *pfVar34 = auVar75._0_4_ + *pfVar44;
                        pfVar34[1] = auVar75._4_4_ + fVar2;
                        pfVar34[2] = auVar75._8_4_ + fVar16;
                        pfVar34[3] = auVar75._12_4_ + fVar17;
                        pfVar34[4] = auVar75._16_4_ + fVar18;
                        pfVar34[5] = auVar75._20_4_ + fVar19;
                        pfVar34[6] = auVar75._24_4_ + fVar20;
                        pfVar34[7] = auVar75._28_4_ + fVar21;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar35 = pauVar35 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar30) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         ((long)local_e8[1].w * uVar32 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pfVar44 = (float *)(local_e8->cstep * uVar32 * local_e8->elemsize +
                                 (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar75 = *pauVar35;
                  uVar50 = uVar54;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    fVar18 = pfVar44[4];
                    fVar19 = pfVar44[5];
                    fVar20 = pfVar44[6];
                    fVar21 = pfVar44[7];
                    *pfVar34 = auVar75._0_4_ + *pfVar44;
                    pfVar34[1] = auVar75._4_4_ + fVar2;
                    pfVar34[2] = auVar75._8_4_ + fVar16;
                    pfVar34[3] = auVar75._12_4_ + fVar17;
                    pfVar34[4] = auVar75._16_4_ + fVar18;
                    pfVar34[5] = auVar75._20_4_ + fVar19;
                    pfVar34[6] = auVar75._24_4_ + fVar20;
                    pfVar34[7] = auVar75._28_4_ + fVar21;
                    pfVar44 = pfVar44 + 8;
                    pfVar34 = pfVar34 + 8;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar35 = pauVar35 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                fVar21 = pfVar34[7];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar75._0_4_ + *pfVar34;
                pfVar44[1] = auVar75._4_4_ + fVar2;
                pfVar44[2] = auVar75._8_4_ + fVar16;
                pfVar44[3] = auVar75._12_4_ + fVar17;
                pfVar44[4] = auVar75._16_4_ + fVar18;
                pfVar44[5] = auVar75._20_4_ + fVar19;
                pfVar44[6] = auVar75._24_4_ + fVar20;
                pfVar44[7] = auVar75._28_4_ + fVar21;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        break;
      }
      local_d0 = sVar8;
      if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a[1].data + a[1].cstep * uVar32 * a[1].elemsize);
            pvVar42 = this_00->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar56 = a->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
              fVar2 = pfVar34[1];
              fVar16 = pfVar34[2];
              fVar17 = pfVar34[3];
              fVar18 = pfVar34[4];
              fVar19 = pfVar34[5];
              fVar20 = pfVar34[6];
              fVar21 = pfVar34[7];
              pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
              *pfVar44 = auVar75._0_4_ + *pfVar34;
              pfVar44[1] = auVar75._4_4_ + fVar2;
              pfVar44[2] = auVar75._8_4_ + fVar16;
              pfVar44[3] = auVar75._12_4_ + fVar17;
              pfVar44[4] = auVar75._16_4_ + fVar18;
              pfVar44[5] = auVar75._20_4_ + fVar19;
              pfVar44[6] = auVar75._24_4_ + fVar20;
              pfVar44[7] = auVar75._28_4_ + fVar21;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      local_d8 = uVar32;
      if (uVar50 == uVar54) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar10 = a->cstep;
              pvVar42 = this_00->data;
              pvVar56 = a[1].data;
              sVar11 = a->elemsize;
              pvVar59 = a->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                fVar2 = *(float *)((long)pvVar56 + lVar55);
                pfVar34 = (float *)((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar32);
                auVar74._0_4_ = fVar2 + *pfVar34;
                auVar74._4_4_ = fVar2 + pfVar34[1];
                auVar74._8_4_ = fVar2 + pfVar34[2];
                auVar74._12_4_ = fVar2 + pfVar34[3];
                auVar74._16_4_ = fVar2 + pfVar34[4];
                auVar74._20_4_ = fVar2 + pfVar34[5];
                auVar74._24_4_ = fVar2 + pfVar34[6];
                auVar74._28_4_ = fVar2 + pfVar34[7];
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 * 8 + sVar7 * sVar8 * uVar32) =
                     auVar74;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_f8 = CONCAT44(local_f8._4_4_,iVar47);
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003d94e9:
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar31 * a->elemsize);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                fVar21 = pfVar34[7];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ + *pfVar34;
                pfVar44[1] = auVar75._4_4_ + fVar2;
                pfVar44[2] = auVar75._8_4_ + fVar16;
                pfVar44[3] = auVar75._12_4_ + fVar17;
                pfVar44[4] = auVar75._16_4_ + fVar18;
                pfVar44[5] = auVar75._20_4_ + fVar19;
                pfVar44[6] = auVar75._24_4_ + fVar20;
                pfVar44[7] = auVar75._28_4_ + fVar21;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
          Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar42 = a->data;
              pvVar56 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar59 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                fVar2 = *(float *)((long)pvVar42 + lVar55);
                pfVar34 = (float *)((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar31);
                auVar78._0_4_ = fVar2 + *pfVar34;
                auVar78._4_4_ = fVar2 + pfVar34[1];
                auVar78._8_4_ = fVar2 + pfVar34[2];
                auVar78._12_4_ = fVar2 + pfVar34[3];
                auVar78._16_4_ = fVar2 + pfVar34[4];
                auVar78._20_4_ = fVar2 + pfVar34[5];
                auVar78._24_4_ = fVar2 + pfVar34[6];
                auVar78._28_4_ = fVar2 + pfVar34[7];
                *(undefined1 (*) [32])((long)pvVar56 + lVar55 * 8 + sVar7 * sVar8 * uVar31) =
                     auVar78;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      else {
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003d94e9;
      }
      local_f8 = CONCAT44(local_f8._4_4_,iVar47);
      if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar42 = a[1].data;
            pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar49 = uVar54;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  fVar21 = pfVar44[7];
                  *pfVar34 = auVar75._0_4_ + *pfVar44;
                  pfVar34[1] = auVar75._4_4_ + fVar2;
                  pfVar34[2] = auVar75._8_4_ + fVar16;
                  pfVar34[3] = auVar75._12_4_ + fVar17;
                  pfVar34[4] = auVar75._16_4_ + fVar18;
                  pfVar34[5] = auVar75._20_4_ + fVar19;
                  pfVar34[6] = auVar75._24_4_ + fVar20;
                  pfVar34[7] = auVar75._28_4_ + fVar21;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar49 = uVar49 - 1;
                } while (uVar49 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar42 = a[1].data;
            uVar49 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                  pfVar44 = (float *)((long)pvVar59 + lVar55);
                  auVar76._0_4_ = *pfVar34 + *pfVar44;
                  auVar76._4_4_ = pfVar34[1] + pfVar44[1];
                  auVar76._8_4_ = pfVar34[2] + pfVar44[2];
                  auVar76._12_4_ = pfVar34[3] + pfVar44[3];
                  auVar76._16_4_ = pfVar34[4] + pfVar44[4];
                  auVar76._20_4_ = pfVar34[5] + pfVar44[5];
                  auVar76._24_4_ = pfVar34[6] + pfVar44[6];
                  auVar76._28_4_ = pfVar34[7] + pfVar44[7];
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar76;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = local_e8->cstep;
            sVar8 = local_e8->elemsize;
            pvVar42 = local_e8->data;
            pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                               (long)local_e8[1].data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar54 = uVar50;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  fVar21 = pfVar44[7];
                  *pfVar34 = auVar75._0_4_ + *pfVar44;
                  pfVar34[1] = auVar75._4_4_ + fVar2;
                  pfVar34[2] = auVar75._8_4_ + fVar16;
                  pfVar34[3] = auVar75._12_4_ + fVar17;
                  pfVar34[4] = auVar75._16_4_ + fVar18;
                  pfVar34[5] = auVar75._20_4_ + fVar19;
                  pfVar34[6] = auVar75._24_4_ + fVar20;
                  pfVar34[7] = auVar75._28_4_ + fVar21;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      pOVar36 = (Option *)opt->blob_allocator;
      local_e8 = a;
      if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
        Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_e8->elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                              (long)local_e8[1].data);
            sVar8 = local_e8->cstep;
            pvVar42 = local_e8->data;
            uVar30 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  pfVar34 = (float *)((long)pvVar59 + lVar55);
                  pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                  auVar80._0_4_ = *pfVar34 + *pfVar44;
                  auVar80._4_4_ = pfVar34[1] + pfVar44[1];
                  auVar80._8_4_ = pfVar34[2] + pfVar44[2];
                  auVar80._12_4_ = pfVar34[3] + pfVar44[3];
                  auVar80._16_4_ = pfVar34[4] + pfVar44[4];
                  auVar80._20_4_ = pfVar34[5] + pfVar44[5];
                  auVar80._24_4_ = pfVar34[6] + pfVar44[6];
                  auVar80._28_4_ = pfVar34[7] + pfVar44[7];
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar80;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
LAB_003d2074:
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      goto LAB_003d207c;
    case 4:
      pOVar36 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003d2074;
      Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = a[1].dims;
      if (iVar29 != 1) {
        if (iVar29 == 3) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar75 = *pauVar35;
                      uVar50 = uVar54;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        fVar21 = pfVar44[7];
                        *pfVar34 = auVar75._0_4_ + *pfVar44;
                        pfVar34[1] = auVar75._4_4_ + fVar2;
                        pfVar34[2] = auVar75._8_4_ + fVar16;
                        pfVar34[3] = auVar75._12_4_ + fVar17;
                        pfVar34[4] = auVar75._16_4_ + fVar18;
                        pfVar34[5] = auVar75._20_4_ + fVar19;
                        pfVar34[6] = auVar75._24_4_ + fVar20;
                        pfVar34[7] = auVar75._28_4_ + fVar21;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar35 = pauVar35 + 1;
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (iVar29 == 2) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  auVar75 = *pauVar35;
                  uVar49 = 0;
                  do {
                    uVar50 = uVar54;
                    if (0 < (int)uVar54) {
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        fVar21 = pfVar44[7];
                        *pfVar34 = auVar75._0_4_ + *pfVar44;
                        pfVar34[1] = auVar75._4_4_ + fVar2;
                        pfVar34[2] = auVar75._8_4_ + fVar16;
                        pfVar34[3] = auVar75._12_4_ + fVar17;
                        pfVar34[4] = auVar75._16_4_ + fVar18;
                        pfVar34[5] = auVar75._20_4_ + fVar19;
                        pfVar34[6] = auVar75._24_4_ + fVar20;
                        pfVar34[7] = auVar75._28_4_ + fVar21;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                pauVar35 = pauVar35 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        return 0;
      }
      if ((int)local_100 != 1 || a[1].w != 1) {
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
            pvVar42 = a->data;
            sVar10 = this_00->cstep;
            sVar11 = this_00->elemsize;
            pvVar56 = this_00->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
              fVar2 = pfVar34[1];
              fVar16 = pfVar34[2];
              fVar17 = pfVar34[3];
              fVar18 = pfVar34[4];
              fVar19 = pfVar34[5];
              fVar20 = pfVar34[6];
              fVar21 = pfVar34[7];
              pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
              *pfVar44 = auVar75._0_4_ + *pfVar34;
              pfVar44[1] = auVar75._4_4_ + fVar2;
              pfVar44[2] = auVar75._8_4_ + fVar16;
              pfVar44[3] = auVar75._12_4_ + fVar17;
              pfVar44[4] = auVar75._16_4_ + fVar18;
              pfVar44[5] = auVar75._20_4_ + fVar19;
              pfVar44[6] = auVar75._24_4_ + fVar20;
              pfVar44[7] = auVar75._28_4_ + fVar21;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
    }
LAB_003da8c7:
    pOVar36 = (Option *)local_110->blob_allocator;
LAB_003da8d0:
    iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                       (a,local_108,this_00,pOVar36);
    return iVar29;
  case 1:
    pMVar43 = pMVar38;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
    uVar54 = a->w;
    uVar30 = a->h;
    iVar33 = a->d;
    uVar49 = a->c;
    uVar31 = (ulong)uVar49;
    local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
    sVar7 = a->elemsize;
    uVar50 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar32 = (ulong)uVar3;
    iVar47 = uVar5 * uVar50 * iVar4;
    sVar8 = a[1].elemsize;
    local_e0 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pfVar34 = (float *)this_00->data;
          if (pfVar34 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar35 = (undefined1 (*) [32])a->data;
          pfVar44 = (float *)a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar75 = *pauVar35;
              uVar30 = uVar50;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                fVar18 = pfVar44[4];
                fVar19 = pfVar44[5];
                fVar20 = pfVar44[6];
                *pfVar34 = auVar75._0_4_ * *pfVar44;
                pfVar34[1] = auVar75._4_4_ * fVar2;
                pfVar34[2] = auVar75._8_4_ * fVar16;
                pfVar34[3] = auVar75._12_4_ * fVar17;
                pfVar34[4] = auVar75._16_4_ * fVar18;
                pfVar34[5] = auVar75._20_4_ * fVar19;
                pfVar34[6] = auVar75._24_4_ * fVar20;
                pfVar34[7] = in_register_0000125c;
                pfVar44 = pfVar44 + 8;
                pfVar34 = pfVar34 + 8;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar35 = pauVar35 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ * *pfVar34;
                pfVar44[1] = auVar75._4_4_ * fVar2;
                pfVar44[2] = auVar75._8_4_ * fVar16;
                pfVar44[3] = auVar75._12_4_ * fVar17;
                pfVar44[4] = auVar75._16_4_ * fVar18;
                pfVar44[5] = auVar75._20_4_ * fVar19;
                pfVar44[6] = auVar75._24_4_ * fVar20;
                pfVar44[7] = in_register_0000125c;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ * *pfVar34;
                pfVar44[1] = auVar75._4_4_ * fVar2;
                pfVar44[2] = auVar75._8_4_ * fVar16;
                pfVar44[3] = auVar75._12_4_ * fVar17;
                pfVar44[4] = auVar75._16_4_ * fVar18;
                pfVar44[5] = auVar75._20_4_ * fVar19;
                pfVar44[6] = auVar75._24_4_ * fVar20;
                pfVar44[7] = in_register_0000125c;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da7c2;
      }
      goto LAB_003d082c;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < (int)uVar5) {
            pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
            pauVar35 = (undefined1 (*) [32])((long)a->w * uVar31 * a->elemsize + (long)a->data);
            uVar54 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *pauVar35;
                uVar30 = uVar50;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  *pfVar34 = auVar75._0_4_ * *pfVar44;
                  pfVar34[1] = auVar75._4_4_ * fVar2;
                  pfVar34[2] = auVar75._8_4_ * fVar16;
                  pfVar34[3] = auVar75._12_4_ * fVar17;
                  pfVar34[4] = auVar75._16_4_ * fVar18;
                  pfVar34[5] = auVar75._20_4_ * fVar19;
                  pfVar34[6] = auVar75._24_4_ * fVar20;
                  pfVar34[7] = in_register_0000125c;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar30 = uVar30 - 1;
                } while (uVar30 != 0);
              }
              pauVar35 = pauVar35 + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar5);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar4) {
            pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                               (long)local_e8[1].data);
            pauVar35 = (undefined1 (*) [32])
                       ((long)local_e8->w * uVar31 * local_e8->elemsize + (long)local_e8->data);
            iVar29 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar75 = *pauVar35;
                uVar54 = 0;
                do {
                  uVar30 = uVar50;
                  if (0 < (int)uVar50) {
                    do {
                      fVar2 = pfVar44[1];
                      fVar16 = pfVar44[2];
                      fVar17 = pfVar44[3];
                      fVar18 = pfVar44[4];
                      fVar19 = pfVar44[5];
                      fVar20 = pfVar44[6];
                      *pfVar34 = auVar75._0_4_ * *pfVar44;
                      pfVar34[1] = auVar75._4_4_ * fVar2;
                      pfVar34[2] = auVar75._8_4_ * fVar16;
                      pfVar34[3] = auVar75._12_4_ * fVar17;
                      pfVar34[4] = auVar75._16_4_ * fVar18;
                      pfVar34[5] = auVar75._20_4_ * fVar19;
                      pfVar34[6] = auVar75._24_4_ * fVar20;
                      pfVar34[7] = in_register_0000125c;
                      pfVar44 = pfVar44 + 8;
                      pfVar34 = pfVar34 + 8;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar5);
              }
              pauVar35 = pauVar35 + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar4);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_e8[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pfVar34 = (float *)this_00->data;
        if (pfVar34 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pfVar44 = (float *)local_e8->data;
          pauVar35 = (undefined1 (*) [32])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar75 = *pauVar35;
              uVar50 = uVar54;
              do {
                fVar2 = pfVar44[1];
                fVar16 = pfVar44[2];
                fVar17 = pfVar44[3];
                fVar18 = pfVar44[4];
                fVar19 = pfVar44[5];
                fVar20 = pfVar44[6];
                *pfVar34 = auVar75._0_4_ * *pfVar44;
                pfVar34[1] = auVar75._4_4_ * fVar2;
                pfVar34[2] = auVar75._8_4_ * fVar16;
                pfVar34[3] = auVar75._12_4_ * fVar17;
                pfVar34[4] = auVar75._16_4_ * fVar18;
                pfVar34[5] = auVar75._20_4_ * fVar19;
                pfVar34[6] = auVar75._24_4_ * fVar20;
                pfVar34[7] = in_register_0000125c;
                pfVar44 = pfVar44 + 8;
                pfVar34 = pfVar34 + 8;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar35 = pauVar35 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      }
LAB_003d52a6:
      if (iVar29 != 2) {
        return 0;
      }
      pOVar36 = (Option *)local_110->blob_allocator;
      a = local_e8;
LAB_003d1e25:
      iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                         (a,local_108,this_00,pOVar36);
      return iVar29;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar4) {
              pfVar34 = (float *)(this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data)
              ;
              pfVar44 = (float *)(local_e8[1].cstep * uVar31 * local_e8[1].elemsize +
                                 (long)local_e8[1].data);
              pauVar35 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar75 = *pauVar35;
                      uVar30 = uVar50;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        *pfVar34 = auVar75._0_4_ * *pfVar44;
                        pfVar34[1] = auVar75._4_4_ * fVar2;
                        pfVar34[2] = auVar75._8_4_ * fVar16;
                        pfVar34[3] = auVar75._12_4_ * fVar17;
                        pfVar34[4] = auVar75._16_4_ * fVar18;
                        pfVar34[5] = auVar75._20_4_ * fVar19;
                        pfVar34[6] = auVar75._24_4_ * fVar20;
                        pfVar34[7] = in_register_0000125c;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar35 = pauVar35 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar30) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         ((long)local_e8[1].w * uVar32 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pfVar44 = (float *)(local_e8->cstep * uVar32 * local_e8->elemsize +
                                 (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar75 = *pauVar35;
                  uVar50 = uVar54;
                  do {
                    fVar2 = pfVar44[1];
                    fVar16 = pfVar44[2];
                    fVar17 = pfVar44[3];
                    fVar18 = pfVar44[4];
                    fVar19 = pfVar44[5];
                    fVar20 = pfVar44[6];
                    *pfVar34 = auVar75._0_4_ * *pfVar44;
                    pfVar34[1] = auVar75._4_4_ * fVar2;
                    pfVar34[2] = auVar75._8_4_ * fVar16;
                    pfVar34[3] = auVar75._12_4_ * fVar17;
                    pfVar34[4] = auVar75._16_4_ * fVar18;
                    pfVar34[5] = auVar75._20_4_ * fVar19;
                    pfVar34[6] = auVar75._24_4_ * fVar20;
                    pfVar34[7] = in_register_0000125c;
                    pfVar44 = pfVar44 + 8;
                    pfVar34 = pfVar34 + 8;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar35 = pauVar35 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                *pfVar44 = auVar75._0_4_ * *pfVar34;
                pfVar44[1] = auVar75._4_4_ * fVar2;
                pfVar44[2] = auVar75._8_4_ * fVar16;
                pfVar44[3] = auVar75._12_4_ * fVar17;
                pfVar44[4] = auVar75._16_4_ * fVar18;
                pfVar44[5] = auVar75._20_4_ * fVar19;
                pfVar44[6] = auVar75._24_4_ * fVar20;
                pfVar44[7] = in_register_0000125c;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        break;
      }
      local_d0 = sVar8;
      if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a[1].data + a[1].cstep * uVar32 * a[1].elemsize);
            pvVar42 = this_00->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar56 = a->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
              fVar2 = pfVar34[1];
              fVar16 = pfVar34[2];
              fVar17 = pfVar34[3];
              fVar18 = pfVar34[4];
              fVar19 = pfVar34[5];
              fVar20 = pfVar34[6];
              pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
              *pfVar44 = auVar75._0_4_ * *pfVar34;
              pfVar44[1] = auVar75._4_4_ * fVar2;
              pfVar44[2] = auVar75._8_4_ * fVar16;
              pfVar44[3] = auVar75._12_4_ * fVar17;
              pfVar44[4] = auVar75._16_4_ * fVar18;
              pfVar44[5] = auVar75._20_4_ * fVar19;
              pfVar44[6] = auVar75._24_4_ * fVar20;
              pfVar44[7] = in_register_0000125c;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      local_d8 = uVar32;
      if (uVar50 == uVar54) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar10 = a->cstep;
              pvVar42 = this_00->data;
              pvVar56 = a[1].data;
              sVar11 = a->elemsize;
              pvVar59 = a->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                fVar2 = *(float *)((long)pvVar56 + lVar55);
                pfVar34 = (float *)((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar32);
                auVar12._4_4_ = fVar2 * pfVar34[1];
                auVar12._0_4_ = fVar2 * *pfVar34;
                auVar12._8_4_ = fVar2 * pfVar34[2];
                auVar12._12_4_ = fVar2 * pfVar34[3];
                auVar12._16_4_ = fVar2 * pfVar34[4];
                auVar12._20_4_ = fVar2 * pfVar34[5];
                auVar12._24_4_ = fVar2 * pfVar34[6];
                auVar12._28_4_ = fVar2;
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 * 8 + sVar7 * sVar8 * uVar32) =
                     auVar12;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_f8 = CONCAT44(local_f8._4_4_,iVar47);
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003d93df:
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar31 * a->elemsize);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                pfVar34 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31);
                fVar2 = pfVar34[1];
                fVar16 = pfVar34[2];
                fVar17 = pfVar34[3];
                fVar18 = pfVar34[4];
                fVar19 = pfVar34[5];
                fVar20 = pfVar34[6];
                pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31);
                *pfVar44 = auVar75._0_4_ * *pfVar34;
                pfVar44[1] = auVar75._4_4_ * fVar2;
                pfVar44[2] = auVar75._8_4_ * fVar16;
                pfVar44[3] = auVar75._12_4_ * fVar17;
                pfVar44[4] = auVar75._16_4_ * fVar18;
                pfVar44[5] = auVar75._20_4_ * fVar19;
                pfVar44[6] = auVar75._24_4_ * fVar20;
                pfVar44[7] = in_register_0000125c;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
          Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar42 = a->data;
              pvVar56 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar59 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                fVar2 = *(float *)((long)pvVar42 + lVar55);
                pfVar34 = (float *)((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar31);
                auVar14._4_4_ = fVar2 * pfVar34[1];
                auVar14._0_4_ = fVar2 * *pfVar34;
                auVar14._8_4_ = fVar2 * pfVar34[2];
                auVar14._12_4_ = fVar2 * pfVar34[3];
                auVar14._16_4_ = fVar2 * pfVar34[4];
                auVar14._20_4_ = fVar2 * pfVar34[5];
                auVar14._24_4_ = fVar2 * pfVar34[6];
                auVar14._28_4_ = fVar2;
                *(undefined1 (*) [32])((long)pvVar56 + lVar55 * 8 + sVar7 * sVar8 * uVar31) =
                     auVar14;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      else {
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003d93df;
      }
      local_f8 = CONCAT44(local_f8._4_4_,iVar47);
      if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar42 = a[1].data;
            pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar49 = uVar54;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  *pfVar34 = auVar75._0_4_ * *pfVar44;
                  pfVar34[1] = auVar75._4_4_ * fVar2;
                  pfVar34[2] = auVar75._8_4_ * fVar16;
                  pfVar34[3] = auVar75._12_4_ * fVar17;
                  pfVar34[4] = auVar75._16_4_ * fVar18;
                  pfVar34[5] = auVar75._20_4_ * fVar19;
                  pfVar34[6] = auVar75._24_4_ * fVar20;
                  pfVar34[7] = in_register_0000125c;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar49 = uVar49 - 1;
                } while (uVar49 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar42 = a[1].data;
            uVar49 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                  pfVar44 = (float *)((long)pvVar59 + lVar55);
                  auVar13._4_4_ = pfVar34[1] * pfVar44[1];
                  auVar13._0_4_ = *pfVar34 * *pfVar44;
                  auVar13._8_4_ = pfVar34[2] * pfVar44[2];
                  auVar13._12_4_ = pfVar34[3] * pfVar44[3];
                  auVar13._16_4_ = pfVar34[4] * pfVar44[4];
                  auVar13._20_4_ = pfVar34[5] * pfVar44[5];
                  auVar13._24_4_ = pfVar34[6] * pfVar44[6];
                  auVar13._28_4_ = pfVar34[7];
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar13;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = local_e8->cstep;
            sVar8 = local_e8->elemsize;
            pvVar42 = local_e8->data;
            pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pfVar44 = (float *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                               (long)local_e8[1].data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar54 = uVar50;
                do {
                  fVar2 = pfVar44[1];
                  fVar16 = pfVar44[2];
                  fVar17 = pfVar44[3];
                  fVar18 = pfVar44[4];
                  fVar19 = pfVar44[5];
                  fVar20 = pfVar44[6];
                  *pfVar34 = auVar75._0_4_ * *pfVar44;
                  pfVar34[1] = auVar75._4_4_ * fVar2;
                  pfVar34[2] = auVar75._8_4_ * fVar16;
                  pfVar34[3] = auVar75._12_4_ * fVar17;
                  pfVar34[4] = auVar75._16_4_ * fVar18;
                  pfVar34[5] = auVar75._20_4_ * fVar19;
                  pfVar34[6] = auVar75._24_4_ * fVar20;
                  pfVar34[7] = in_register_0000125c;
                  pfVar44 = pfVar44 + 8;
                  pfVar34 = pfVar34 + 8;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      pOVar36 = (Option *)opt->blob_allocator;
      local_e8 = a;
      if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
        Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_e8->elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                              (long)local_e8[1].data);
            sVar8 = local_e8->cstep;
            pvVar42 = local_e8->data;
            uVar30 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  pfVar34 = (float *)((long)pvVar59 + lVar55);
                  pfVar44 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
                  auVar15._4_4_ = pfVar34[1] * pfVar44[1];
                  auVar15._0_4_ = *pfVar34 * *pfVar44;
                  auVar15._8_4_ = pfVar34[2] * pfVar44[2];
                  auVar15._12_4_ = pfVar34[3] * pfVar44[3];
                  auVar15._16_4_ = pfVar34[4] * pfVar44[4];
                  auVar15._20_4_ = pfVar34[5] * pfVar44[5];
                  auVar15._24_4_ = pfVar34[6] * pfVar44[6];
                  auVar15._28_4_ = pfVar34[7];
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar15;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
LAB_003d1e1d:
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      goto LAB_003d1e25;
    case 4:
      pOVar36 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003d1e1d;
      Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = a[1].dims;
      if (iVar29 != 1) {
        if (iVar29 == 3) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar75 = *pauVar35;
                      uVar50 = uVar54;
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        *pfVar34 = auVar75._0_4_ * *pfVar44;
                        pfVar34[1] = auVar75._4_4_ * fVar2;
                        pfVar34[2] = auVar75._8_4_ * fVar16;
                        pfVar34[3] = auVar75._12_4_ * fVar17;
                        pfVar34[4] = auVar75._16_4_ * fVar18;
                        pfVar34[5] = auVar75._20_4_ * fVar19;
                        pfVar34[6] = auVar75._24_4_ * fVar20;
                        pfVar34[7] = in_register_0000125c;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar35 = pauVar35 + 1;
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (iVar29 == 2) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pfVar34 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              pauVar35 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar44 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  auVar75 = *pauVar35;
                  uVar49 = 0;
                  do {
                    uVar50 = uVar54;
                    if (0 < (int)uVar54) {
                      do {
                        fVar2 = pfVar44[1];
                        fVar16 = pfVar44[2];
                        fVar17 = pfVar44[3];
                        fVar18 = pfVar44[4];
                        fVar19 = pfVar44[5];
                        fVar20 = pfVar44[6];
                        *pfVar34 = auVar75._0_4_ * *pfVar44;
                        pfVar34[1] = auVar75._4_4_ * fVar2;
                        pfVar34[2] = auVar75._8_4_ * fVar16;
                        pfVar34[3] = auVar75._12_4_ * fVar17;
                        pfVar34[4] = auVar75._16_4_ * fVar18;
                        pfVar34[5] = auVar75._20_4_ * fVar19;
                        pfVar34[6] = auVar75._24_4_ * fVar20;
                        pfVar34[7] = in_register_0000125c;
                        pfVar44 = pfVar44 + 8;
                        pfVar34 = pfVar34 + 8;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                pauVar35 = pauVar35 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        return 0;
      }
      if ((int)local_100 != 1 || a[1].w != 1) {
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
            pvVar42 = a->data;
            sVar10 = this_00->cstep;
            sVar11 = this_00->elemsize;
            pvVar56 = this_00->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              pfVar34 = (float *)((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32);
              fVar2 = pfVar34[1];
              fVar16 = pfVar34[2];
              fVar17 = pfVar34[3];
              fVar18 = pfVar34[4];
              fVar19 = pfVar34[5];
              fVar20 = pfVar34[6];
              pfVar44 = (float *)((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32);
              *pfVar44 = auVar75._0_4_ * *pfVar34;
              pfVar44[1] = auVar75._4_4_ * fVar2;
              pfVar44[2] = auVar75._8_4_ * fVar16;
              pfVar44[3] = auVar75._12_4_ * fVar17;
              pfVar44[4] = auVar75._16_4_ * fVar18;
              pfVar44[5] = auVar75._20_4_ * fVar19;
              pfVar44[6] = auVar75._24_4_ * fVar20;
              pfVar44[7] = in_register_0000125c;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
    }
LAB_003da7b9:
    pOVar36 = (Option *)local_110->blob_allocator;
LAB_003da7c2:
    iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                       (a,local_108,this_00,pOVar36);
    return iVar29;
  case 3:
    pMVar43 = pMVar38;
    goto LAB_003d06de;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
    uVar54 = a->w;
    uVar30 = a->h;
    iVar33 = a->d;
    uVar49 = a->c;
    uVar31 = (ulong)uVar49;
    local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
    sVar7 = a->elemsize;
    uVar50 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar32 = (ulong)uVar3;
    iVar47 = uVar5 * uVar50 * iVar4;
    sVar8 = a[1].elemsize;
    local_e0 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar29 == 1 && uVar54 == 1) goto LAB_003d077e;
      switch(a[1].dims) {
      case 1:
        Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        pOVar36 = (Option *)local_110->blob_allocator;
        if ((int)local_100 != 1 || a[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                    (a,local_108,this_00,pOVar36);
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
        pauVar35 = (undefined1 (*) [32])this_00->data;
        if (pauVar35 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar5 < 1) {
          return 0;
        }
        pauVar37 = (undefined1 (*) [32])a->data;
        pauVar45 = (undefined1 (*) [32])a[1].data;
        uVar54 = 0;
        do {
          if (0 < (int)uVar50) {
            auVar75 = *pauVar37;
            uVar30 = uVar50;
            do {
              auVar79 = vmaxps_avx(auVar75,*pauVar45);
              *pauVar35 = auVar79;
              pauVar45 = pauVar45 + 1;
              pauVar35 = pauVar35 + 1;
              uVar30 = uVar30 - 1;
            } while (uVar30 != 0);
          }
          pauVar37 = pauVar37 + 1;
          uVar54 = uVar54 + 1;
        } while (uVar54 != uVar5);
        return 0;
      case 3:
        Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar47) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
            pvVar42 = this_00->data;
            sVar10 = a[1].cstep;
            sVar11 = a[1].elemsize;
            pvVar56 = a[1].data;
            lVar55 = 0;
            iVar29 = iVar47;
            do {
              auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
              *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      case 4:
        Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar47) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
            pvVar42 = this_00->data;
            sVar10 = a[1].cstep;
            sVar11 = a[1].elemsize;
            pvVar56 = a[1].data;
            lVar55 = 0;
            iVar29 = iVar47;
            do {
              auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
              *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      default:
        goto LAB_003dd905;
      }
      goto LAB_003da625;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])(a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
            pauVar45 = (undefined1 (*) [32])((long)a->w * uVar31 * a->elemsize + (long)a->data);
            uVar54 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *pauVar45;
                uVar30 = uVar50;
                do {
                  auVar79 = vmaxps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar30 = uVar30 - 1;
                } while (uVar30 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar5);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar4) {
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])
                       (local_e8[1].cstep * uVar31 * local_e8[1].elemsize + (long)local_e8[1].data);
            pauVar45 = (undefined1 (*) [32])
                       ((long)local_e8->w * uVar31 * local_e8->elemsize + (long)local_e8->data);
            iVar29 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar75 = *pauVar45;
                uVar54 = 0;
                do {
                  uVar30 = uVar50;
                  if (0 < (int)uVar50) {
                    do {
                      auVar79 = vmaxps_avx(auVar75,*pauVar37);
                      *pauVar35 = auVar79;
                      pauVar37 = pauVar37 + 1;
                      pauVar35 = pauVar35 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar5);
              }
              pauVar45 = pauVar45 + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar4);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_e8[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pauVar35 = (undefined1 (*) [32])this_00->data;
        if (pauVar35 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pauVar37 = (undefined1 (*) [32])local_e8->data;
          pauVar45 = (undefined1 (*) [32])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar75 = *pauVar45;
              uVar50 = uVar54;
              do {
                auVar79 = vmaxps_avx(auVar75,*pauVar37);
                *pauVar35 = auVar79;
                pauVar37 = pauVar37 + 1;
                pauVar35 = pauVar35 + 1;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar45 = pauVar45 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      }
LAB_003d4e1d:
      if (iVar29 != 2) {
        return 0;
      }
      pOVar36 = (Option *)local_110->blob_allocator;
      a = local_e8;
LAB_003d1bce:
      iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                         (a,local_108,this_00,pOVar36);
      return iVar29;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar4) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         (local_e8[1].cstep * uVar31 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar45 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar75 = *pauVar45;
                      uVar30 = uVar50;
                      do {
                        auVar79 = vmaxps_avx(auVar75,*pauVar37);
                        *pauVar35 = auVar79;
                        pauVar37 = pauVar37 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar45 = pauVar45 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar30) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)local_e8[1].w * uVar32 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pauVar45 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar75 = *pauVar37;
                  uVar50 = uVar54;
                  do {
                    auVar79 = vmaxps_avx(auVar75,*pauVar45);
                    *pauVar35 = auVar79;
                    pauVar45 = pauVar45 + 1;
                    pauVar35 = pauVar35 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        break;
      }
      local_d0 = sVar8;
      if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a[1].data + a[1].cstep * uVar32 * a[1].elemsize);
            pvVar42 = this_00->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar56 = a->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
              *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      local_d8 = uVar32;
      if (uVar50 == uVar54) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar10 = a->cstep;
              pvVar42 = this_00->data;
              pvVar56 = a[1].data;
              sVar11 = a->elemsize;
              pvVar59 = a->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                uVar1 = *(undefined4 *)((long)pvVar56 + lVar55);
                auVar73._4_4_ = uVar1;
                auVar73._0_4_ = uVar1;
                auVar73._8_4_ = uVar1;
                auVar73._12_4_ = uVar1;
                auVar73._16_4_ = uVar1;
                auVar73._20_4_ = uVar1;
                auVar73._24_4_ = uVar1;
                auVar73._28_4_ = uVar1;
                auVar75 = vmaxps_avx(auVar73,*(undefined1 (*) [32])
                                              ((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar32
                                              ));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 * 8 + sVar7 * sVar8 * uVar32) =
                     auVar75;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_f8 = CONCAT44(local_f8._4_4_,iVar47);
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003d92d5:
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar31 * a->elemsize);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
          Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar42 = a->data;
              pvVar56 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar59 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                uVar1 = *(undefined4 *)((long)pvVar42 + lVar55);
                auVar77._4_4_ = uVar1;
                auVar77._0_4_ = uVar1;
                auVar77._8_4_ = uVar1;
                auVar77._12_4_ = uVar1;
                auVar77._16_4_ = uVar1;
                auVar77._20_4_ = uVar1;
                auVar77._24_4_ = uVar1;
                auVar77._28_4_ = uVar1;
                auVar75 = vmaxps_avx(auVar77,*(undefined1 (*) [32])
                                              ((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar31
                                              ));
                *(undefined1 (*) [32])((long)pvVar56 + lVar55 * 8 + sVar7 * sVar8 * uVar31) =
                     auVar75;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      else {
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003d92d5;
      }
      local_f8 = CONCAT44(local_f8._4_4_,iVar47);
      if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar42 = a[1].data;
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar49 = uVar54;
                do {
                  auVar79 = vmaxps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar49 = uVar49 - 1;
                } while (uVar49 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar42 = a[1].data;
            uVar49 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  auVar75 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar59 + lVar55),
                                       *(undefined1 (*) [32])
                                        ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar75;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = local_e8->cstep;
            sVar8 = local_e8->elemsize;
            pvVar42 = local_e8->data;
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])
                       (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar54 = uVar50;
                do {
                  auVar79 = vmaxps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      pOVar36 = (Option *)opt->blob_allocator;
      local_e8 = a;
      if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
        Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_e8->elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                              (long)local_e8[1].data);
            sVar8 = local_e8->cstep;
            pvVar42 = local_e8->data;
            uVar30 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  auVar75 = vmaxps_avx(*(undefined1 (*) [32])
                                        ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32),
                                       *(undefined1 (*) [32])((long)pvVar59 + lVar55));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar75;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
LAB_003d1bc6:
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      goto LAB_003d1bce;
    case 4:
      pOVar36 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003d1bc6;
      Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = a[1].dims;
      if (iVar29 != 1) {
        if (iVar29 == 3) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar45 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar75 = *pauVar37;
                      uVar50 = uVar54;
                      do {
                        auVar79 = vmaxps_avx(auVar75,*pauVar45);
                        *pauVar35 = auVar79;
                        pauVar45 = pauVar45 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar37 = pauVar37 + 1;
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (iVar29 == 2) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar45 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  auVar75 = *pauVar37;
                  uVar49 = 0;
                  do {
                    uVar50 = uVar54;
                    if (0 < (int)uVar54) {
                      do {
                        auVar79 = vmaxps_avx(auVar75,*pauVar45);
                        *pauVar35 = auVar79;
                        pauVar45 = pauVar45 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                pauVar37 = pauVar37 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        return 0;
      }
      if ((int)local_100 != 1 || a[1].w != 1) {
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
            pvVar42 = a->data;
            sVar10 = this_00->cstep;
            sVar11 = this_00->elemsize;
            pvVar56 = this_00->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              auVar79 = vmaxps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32));
              *(undefined1 (*) [32])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
    }
LAB_003da61c:
    pOVar36 = (Option *)local_110->blob_allocator;
LAB_003da625:
    iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                       (a,local_108,this_00,pOVar36);
    return iVar29;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
    local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
    uVar54 = a->w;
    uVar30 = a->h;
    iVar33 = a->d;
    uVar49 = a->c;
    uVar31 = (ulong)uVar49;
    local_f8 = CONCAT44(local_f8._4_4_,uVar30 * uVar54 * iVar33);
    sVar7 = a->elemsize;
    uVar50 = a[1].w;
    uVar5 = a[1].h;
    iVar4 = a[1].d;
    uVar3 = a[1].c;
    uVar32 = (ulong)uVar3;
    iVar47 = uVar5 * uVar50 * iVar4;
    sVar8 = a[1].elemsize;
    local_e0 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          pOVar36 = (Option *)local_110->blob_allocator;
          if ((int)local_100 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                      (a,local_108,this_00,pOVar36);
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar50,uVar5,sVar8,_elempack,opt->blob_allocator);
          pauVar35 = (undefined1 (*) [32])this_00->data;
          if (pauVar35 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar5 < 1) {
            return 0;
          }
          pauVar37 = (undefined1 (*) [32])a->data;
          pauVar45 = (undefined1 (*) [32])a[1].data;
          uVar54 = 0;
          do {
            if (0 < (int)uVar50) {
              auVar75 = *pauVar37;
              uVar30 = uVar50;
              do {
                auVar79 = vminps_avx(auVar75,*pauVar45);
                *pauVar35 = auVar79;
                pauVar45 = pauVar45 + 1;
                pauVar35 = pauVar35 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pauVar37 = pauVar37 + 1;
            uVar54 = uVar54 + 1;
          } while (uVar54 != uVar5);
          return 0;
        case 3:
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        case 4:
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar47) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + uVar31 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = iVar47;
              do {
                auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        default:
          goto LAB_003dd905;
        }
        goto LAB_003da97c;
      }
      goto LAB_003d0903;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < (int)uVar5) {
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])(a[1].cstep * uVar31 * a[1].elemsize + (long)a[1].data);
            pauVar45 = (undefined1 (*) [32])((long)a->w * uVar31 * a->elemsize + (long)a->data);
            uVar54 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *pauVar45;
                uVar30 = uVar50;
                do {
                  auVar79 = vminps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar30 = uVar30 - 1;
                } while (uVar30 != 0);
              }
              pauVar45 = pauVar45 + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 != uVar5);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar31 = 0;
        do {
          if (0 < iVar4) {
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])
                       (local_e8[1].cstep * uVar31 * local_e8[1].elemsize + (long)local_e8[1].data);
            pauVar45 = (undefined1 (*) [32])
                       ((long)local_e8->w * uVar31 * local_e8->elemsize + (long)local_e8->data);
            iVar29 = 0;
            do {
              if (0 < (int)uVar5) {
                auVar75 = *pauVar45;
                uVar54 = 0;
                do {
                  uVar30 = uVar50;
                  if (0 < (int)uVar50) {
                    do {
                      auVar79 = vminps_avx(auVar75,*pauVar37);
                      *pauVar35 = auVar79;
                      pauVar37 = pauVar37 + 1;
                      pauVar35 = pauVar35 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  uVar54 = uVar54 + 1;
                } while (uVar54 != uVar5);
              }
              pauVar45 = pauVar45 + 1;
              iVar29 = iVar29 + 1;
            } while (iVar29 != iVar4);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar32);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_e8[1].dims;
      a = local_e8;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar54,uVar30,sVar7,(uint)local_f0,local_110->blob_allocator);
        pauVar35 = (undefined1 (*) [32])this_00->data;
        if (pauVar35 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar30 < 1) {
            return 0;
          }
          pauVar37 = (undefined1 (*) [32])local_e8->data;
          pauVar45 = (undefined1 (*) [32])local_e8[1].data;
          uVar49 = 0;
          do {
            if (0 < (int)uVar54) {
              auVar75 = *pauVar45;
              uVar50 = uVar54;
              do {
                auVar79 = vminps_avx(auVar75,*pauVar37);
                *pauVar35 = auVar79;
                pauVar37 = pauVar37 + 1;
                pauVar35 = pauVar35 + 1;
                uVar50 = uVar50 - 1;
              } while (uVar50 != 0);
            }
            pauVar45 = pauVar45 + 1;
            uVar49 = uVar49 + 1;
          } while (uVar49 != uVar30);
          return 0;
        }
        break;
      }
joined_r0x003d55ff:
      if (iVar29 != 2) {
        return 0;
      }
      pOVar36 = (Option *)local_110->blob_allocator;
      local_e8 = a;
LAB_003d245e:
      iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                         (a,local_108,this_00,pOVar36);
      return iVar29;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar5,iVar4,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < iVar4) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar31 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         (local_e8[1].cstep * uVar31 * local_e8[1].elemsize + (long)local_e8[1].data
                         );
              pauVar45 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar31 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar5) {
                  uVar54 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      auVar75 = *pauVar45;
                      uVar30 = uVar50;
                      do {
                        auVar79 = vminps_avx(auVar75,*pauVar37);
                        *pauVar35 = auVar79;
                        pauVar37 = pauVar37 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    pauVar45 = pauVar45 + 1;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar5);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar4);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        local_e8 = a;
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_e8[1].dims != 1) {
          if (local_e8[1].dims != 2) {
            return 0;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)uVar30) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)local_e8[1].w * uVar32 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pauVar45 = (undefined1 (*) [32])
                         (local_e8->cstep * uVar32 * local_e8->elemsize + (long)local_e8->data);
              uVar49 = 0;
              do {
                if (0 < (int)uVar54) {
                  auVar75 = *pauVar37;
                  uVar50 = uVar54;
                  do {
                    auVar79 = vminps_avx(auVar75,*pauVar45);
                    *pauVar35 = auVar79;
                    pauVar45 = pauVar45 + 1;
                    pauVar35 = pauVar35 + 1;
                    uVar50 = uVar50 - 1;
                  } while (uVar50 != 0);
                }
                pauVar37 = pauVar37 + 1;
                uVar49 = uVar49 + 1;
              } while (uVar49 != uVar30);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        a = local_e8;
        if ((int)local_100 != 1 || local_e8[1].w != 1) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
              pvVar42 = this_00->data;
              sVar10 = local_e8->cstep;
              sVar11 = local_e8->elemsize;
              pvVar56 = local_e8->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        break;
      }
      local_d0 = sVar8;
      if (uVar3 == uVar49 && ((uVar50 ^ 1) == 0 && (uVar5 ^ 1) == 0)) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)a[1].data + a[1].cstep * uVar32 * a[1].elemsize);
            pvVar42 = this_00->data;
            sVar10 = a->cstep;
            sVar11 = a->elemsize;
            pvVar56 = a->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32));
              *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      local_d8 = uVar32;
      if (uVar50 == uVar54) {
        if (_elempack == 1 && (uVar3 == 1 && uVar5 == uVar30)) {
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              sVar10 = a->cstep;
              pvVar42 = this_00->data;
              pvVar56 = a[1].data;
              sVar11 = a->elemsize;
              pvVar59 = a->data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                uVar1 = *(undefined4 *)((long)pvVar56 + lVar55);
                auVar75._4_4_ = uVar1;
                auVar75._0_4_ = uVar1;
                auVar75._8_4_ = uVar1;
                auVar75._12_4_ = uVar1;
                auVar75._16_4_ = uVar1;
                auVar75._20_4_ = uVar1;
                auVar75._24_4_ = uVar1;
                auVar75._28_4_ = uVar1;
                auVar75 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar32
                                              ));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 * 8 + sVar7 * sVar8 * uVar32) =
                     auVar75;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        local_f8 = CONCAT44(local_f8._4_4_,iVar47);
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) {
LAB_003d95f3:
          local_f8 = CONCAT44(local_f8._4_4_,iVar47);
          Mat::create(this_00,uVar50,uVar5,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              auVar75 = *(undefined1 (*) [32])((long)a->data + a->cstep * uVar31 * a->elemsize);
              pvVar42 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar56 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                              ((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar31));
                *(undefined1 (*) [32])((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar31) = auVar79;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
        if (((iVar29 == 1) && (uVar5 == uVar30)) && (uVar49 == 1)) {
          Mat::create(this_00,uVar54,uVar30,uVar3,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar3 < 1) {
            return 0;
          }
          uVar31 = 0;
          do {
            if (0 < (int)local_f8) {
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar42 = a->data;
              pvVar56 = this_00->data;
              sVar10 = a[1].cstep;
              sVar11 = a[1].elemsize;
              pvVar59 = a[1].data;
              lVar55 = 0;
              iVar29 = (int)local_f8;
              do {
                uVar1 = *(undefined4 *)((long)pvVar42 + lVar55);
                auVar79._4_4_ = uVar1;
                auVar79._0_4_ = uVar1;
                auVar79._8_4_ = uVar1;
                auVar79._12_4_ = uVar1;
                auVar79._16_4_ = uVar1;
                auVar79._20_4_ = uVar1;
                auVar79._24_4_ = uVar1;
                auVar79._28_4_ = uVar1;
                auVar75 = vminps_avx(auVar79,*(undefined1 (*) [32])
                                              ((long)pvVar59 + lVar55 * 8 + sVar10 * sVar11 * uVar31
                                              ));
                *(undefined1 (*) [32])((long)pvVar56 + lVar55 * 8 + sVar7 * sVar8 * uVar31) =
                     auVar75;
                lVar55 = lVar55 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar32);
          return 0;
        }
      }
      else {
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((uVar54 == 1 && uVar30 == 1) && uVar3 == uVar49) goto LAB_003d95f3;
      }
      local_f8 = CONCAT44(local_f8._4_4_,iVar47);
      if ((((uVar50 ^ 1) == 0 && uVar5 == uVar30) && uVar49 == uVar3) && uVar54 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].cstep;
            sVar8 = a[1].elemsize;
            pvVar42 = a[1].data;
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar54) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar49 = uVar54;
                do {
                  auVar79 = vminps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar49 = uVar49 - 1;
                } while (uVar49 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if (((uVar50 == uVar54 && (uVar5 ^ 1) == 0) && uVar49 == uVar3) && uVar30 != 1) {
        Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = a[1].elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
            sVar8 = a[1].cstep;
            pvVar42 = a[1].data;
            uVar49 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  auVar75 = vminps_avx(*(undefined1 (*) [32])((long)pvVar59 + lVar55),
                                       *(undefined1 (*) [32])
                                        ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar75;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      if ((uVar3 == uVar49 && uVar5 == uVar30) && (uVar50 != 1 && uVar54 == 1)) {
        local_e8 = a;
        Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar30) {
            sVar7 = local_e8->cstep;
            sVar8 = local_e8->elemsize;
            pvVar42 = local_e8->data;
            pauVar35 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pauVar37 = (undefined1 (*) [32])
                       (local_e8[1].cstep * uVar32 * local_e8[1].elemsize + (long)local_e8[1].data);
            uVar48 = 0;
            do {
              if (0 < (int)uVar50) {
                auVar75 = *(undefined1 (*) [32])
                           ((long)pvVar42 + uVar48 * 0x20 + sVar7 * uVar32 * sVar8);
                uVar54 = uVar50;
                do {
                  auVar79 = vminps_avx(auVar75,*pauVar37);
                  *pauVar35 = auVar79;
                  pauVar37 = pauVar37 + 1;
                  pauVar35 = pauVar35 + 1;
                  uVar54 = uVar54 - 1;
                } while (uVar54 != 0);
              }
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar30);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
      pOVar36 = (Option *)opt->blob_allocator;
      local_e8 = a;
      if (((byte)local_c4 & uVar3 == uVar49 & (uVar5 != 1 && uVar50 == uVar54)) == 1) {
        Mat::create(this_00,uVar54,uVar5,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)uVar5) {
            sVar7 = local_e8->elemsize;
            pvVar56 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            pvVar59 = (void *)(local_e8[1].cstep * uVar32 * local_e8[1].elemsize +
                              (long)local_e8[1].data);
            sVar8 = local_e8->cstep;
            pvVar42 = local_e8->data;
            uVar30 = 0;
            do {
              if (0 < (int)uVar54) {
                lVar55 = 0;
                do {
                  auVar75 = vminps_avx(*(undefined1 (*) [32])
                                        ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32),
                                       *(undefined1 (*) [32])((long)pvVar59 + lVar55));
                  *(undefined1 (*) [32])((long)pvVar56 + lVar55) = auVar75;
                  lVar55 = lVar55 + 0x20;
                } while ((ulong)uVar54 << 5 != lVar55);
                pvVar56 = (void *)((long)pvVar56 + lVar55);
                pvVar59 = (void *)((long)pvVar59 + lVar55);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
LAB_003d2456:
      local_100 = (__m256 *)CONCAT44(local_100._4_4_,_elempack);
      local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
      goto LAB_003d245e;
    case 4:
      pOVar36 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003d2456;
      Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = a[1].dims;
      if (iVar29 != 1) {
        if (iVar29 == 3) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar45 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar49 = 0;
                  do {
                    if (0 < (int)uVar54) {
                      auVar75 = *pauVar37;
                      uVar50 = uVar54;
                      do {
                        auVar79 = vminps_avx(auVar75,*pauVar45);
                        *pauVar35 = auVar79;
                        pauVar45 = pauVar45 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    pauVar37 = pauVar37 + 1;
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        if (iVar29 == 2) {
          if ((int)uVar49 < 1) {
            return 0;
          }
          uVar32 = 0;
          do {
            if (0 < iVar33) {
              pauVar35 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar45 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              iVar29 = 0;
              do {
                if (0 < (int)uVar30) {
                  auVar75 = *pauVar37;
                  uVar49 = 0;
                  do {
                    uVar50 = uVar54;
                    if (0 < (int)uVar54) {
                      do {
                        auVar79 = vminps_avx(auVar75,*pauVar45);
                        *pauVar35 = auVar79;
                        pauVar45 = pauVar45 + 1;
                        pauVar35 = pauVar35 + 1;
                        uVar50 = uVar50 - 1;
                      } while (uVar50 != 0);
                    }
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar30);
                }
                pauVar37 = pauVar37 + 1;
                iVar29 = iVar29 + 1;
              } while (iVar29 != iVar33);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar31);
          return 0;
        }
        return 0;
      }
      if ((int)local_100 != 1 || a[1].w != 1) {
        if ((int)uVar49 < 1) {
          return 0;
        }
        uVar32 = 0;
        do {
          if (0 < (int)local_f8) {
            sVar7 = a->cstep;
            sVar8 = a->elemsize;
            auVar75 = *(undefined1 (*) [32])((long)local_108->data + uVar32 * 0x20);
            pvVar42 = a->data;
            sVar10 = this_00->cstep;
            sVar11 = this_00->elemsize;
            pvVar56 = this_00->data;
            lVar55 = 0;
            iVar29 = (int)local_f8;
            do {
              auVar79 = vminps_avx(auVar75,*(undefined1 (*) [32])
                                            ((long)pvVar42 + lVar55 + sVar7 * sVar8 * uVar32));
              *(undefined1 (*) [32])((long)pvVar56 + lVar55 + sVar10 * sVar11 * uVar32) = auVar79;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar31);
        return 0;
      }
    }
LAB_003da973:
    pOVar36 = (Option *)local_110->blob_allocator;
LAB_003da97c:
    iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                       (a,local_108,this_00,pOVar36);
    return iVar29;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar54 = a->w;
    local_100 = (__m256 *)(ulong)uVar54;
    uVar30 = a->h;
    local_108 = (Mat *)(ulong)uVar30;
    iVar33 = a->d;
    uVar49 = a->c;
    local_d8 = (ulong)uVar49;
    local_e0 = CONCAT44(local_e0._4_4_,uVar30 * uVar54 * iVar33);
    sVar7 = a->elemsize;
    uVar50 = a[1].w;
    local_f0._0_4_ = a[1].h;
    iVar4 = a[1].d;
    uVar5 = a[1].c;
    local_d0 = (ulong)uVar5;
    local_110 = (Option *)CONCAT44(local_110._4_4_,uVar50);
    local_f8 = CONCAT44(local_f8._4_4_,iVar4);
    local_c4 = (uint)local_f0 * uVar50 * iVar4;
    sVar8 = a[1].elemsize;
    local_68 = sVar7;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar54 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003d0668_caseD_1;
        case 2:
          local_e8 = a;
          Mat::create(this_00,uVar50,(uint)local_f0,sVar8,_elempack,opt->blob_allocator);
          puVar40 = (undefined8 *)this_00->data;
          if (puVar40 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)(uint)local_f0 < 1) {
            return 0;
          }
          local_108 = (Mat *)local_e8->data;
          pafVar39 = (__m256 *)local_e8[1].data;
          local_100 = (__m256 *)((ulong)local_100 & 0xffffffff00000000);
          do {
            local_a0 = *(__m256 *)local_108;
            iVar29 = (uint)local_110;
            if (0 < (int)(uint)local_110) {
              do {
                uVar94 = *(undefined8 *)*pafVar39;
                uVar93 = *(undefined8 *)(*pafVar39 + 2);
                uVar96 = *(undefined8 *)(*pafVar39 + 4);
                uVar97 = *(undefined8 *)(*pafVar39 + 6);
                local_c0 = *pafVar39;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_a0,&local_c0);
                *puVar40 = uVar94;
                puVar40[1] = uVar93;
                puVar40[2] = uVar96;
                puVar40[3] = uVar97;
                pafVar39 = pafVar39 + 1;
                puVar40 = puVar40 + 4;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 0x20);
            uVar54 = (int)local_100 + 1;
            local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar54);
          } while (uVar54 != (uint)local_f0);
          return 0;
        case 3:
          local_e8 = a;
          Mat::create(this_00,uVar50,(uint)local_f0,uVar5,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d0 < 1) {
            return 0;
          }
          local_108 = (Mat *)0x0;
          do {
            local_a0 = *(__m256 *)((long)local_e8->data + (long)local_108 * 0x20);
            if (0 < local_c4) {
              local_110 = (Option *)
                          (this_00->cstep * this_00->elemsize * (long)local_108 +
                          (long)this_00->data);
              local_f0 = (__m256 *)
                         (local_e8[1].cstep * local_e8[1].elemsize * (long)local_108 +
                         (long)local_e8[1].data);
              lVar55 = 0;
              iVar29 = local_c4;
              do {
                pafVar39 = (__m256 *)((long)local_f0 + lVar55);
                uVar94 = *(undefined8 *)*pafVar39;
                uVar93 = *(undefined8 *)(*pafVar39 + 2);
                uVar96 = *(undefined8 *)(*pafVar39 + 4);
                uVar97 = *(undefined8 *)(*pafVar39 + 6);
                local_c0 = *pafVar39;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_a0,&local_c0);
                puVar40 = (undefined8 *)((long)local_110 + lVar55);
                *puVar40 = uVar94;
                puVar40[1] = uVar93;
                puVar40[2] = uVar96;
                puVar40[3] = uVar97;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 1);
          } while (local_108 != (Mat *)local_d0);
          return 0;
        case 4:
          local_e8 = a;
          Mat::create(this_00,uVar50,(uint)local_f0,iVar4,uVar5,sVar8,_elempack,opt->blob_allocator)
          ;
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d0 < 1) {
            return 0;
          }
          local_108 = (Mat *)0x0;
          do {
            local_a0 = *(__m256 *)((long)local_e8->data + (long)local_108 * 0x20);
            if (0 < local_c4) {
              local_110 = (Option *)
                          (this_00->cstep * this_00->elemsize * (long)local_108 +
                          (long)this_00->data);
              local_f0 = (__m256 *)
                         (local_e8[1].cstep * local_e8[1].elemsize * (long)local_108 +
                         (long)local_e8[1].data);
              lVar55 = 0;
              iVar29 = local_c4;
              do {
                pafVar39 = (__m256 *)((long)local_f0 + lVar55);
                uVar94 = *(undefined8 *)*pafVar39;
                uVar93 = *(undefined8 *)(*pafVar39 + 2);
                uVar96 = *(undefined8 *)(*pafVar39 + 4);
                uVar97 = *(undefined8 *)(*pafVar39 + 6);
                local_c0 = *pafVar39;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_a0,&local_c0);
                puVar40 = (undefined8 *)((long)local_110 + lVar55);
                *puVar40 = uVar94;
                puVar40[1] = uVar93;
                puVar40[2] = uVar96;
                puVar40[3] = uVar97;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 1);
          } while (local_108 != (Mat *)local_d0);
          return 0;
        default:
          return 0;
        }
      }
      goto LAB_003d09bf;
    case 2:
      pAVar9 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_e8 = a;
        Mat::create(this_00,uVar50,(uint)local_f0,uVar5,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_d0 < 1) {
          return 0;
        }
        local_f8 = 0;
        uVar54 = (uint)local_f0;
        do {
          if (0 < (int)uVar54) {
            pafVar52 = (__m256 *)
                       (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
            pafVar39 = (__m256 *)
                       (local_e8[1].cstep * local_f8 * local_e8[1].elemsize + (long)local_e8[1].data
                       );
            local_108 = (Mat *)((long)local_e8->w * local_f8 * local_e8->elemsize +
                               (long)local_e8->data);
            uVar30 = 0;
            do {
              local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar30);
              local_a0 = *(__m256 *)local_108;
              iVar29 = (uint)local_110;
              if (0 < (int)(uint)local_110) {
                do {
                  local_c0 = *pafVar39;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_111,&local_a0,&local_c0);
                  *pafVar52 = local_c0;
                  pafVar39 = pafVar39 + 1;
                  pafVar52 = pafVar52 + 1;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 0x20);
              uVar30 = (int)local_100 + 1;
              uVar54 = (uint)local_f0;
            } while (uVar30 != (uint)local_f0);
          }
          local_f8 = local_f8 + 1;
        } while (local_f8 != local_d0);
        return 0;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,(uint)local_f0,iVar4,uVar5,sVar8,_elempack,pAVar9);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_d0 < 1) {
          return 0;
        }
        local_d8 = 0;
        uVar54 = (uint)local_f0;
        do {
          if (0 < (int)local_f8) {
            pafVar39 = (__m256 *)
                       (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
            pafVar52 = (__m256 *)
                       (local_e8[1].cstep * local_d8 * local_e8[1].elemsize + (long)local_e8[1].data
                       );
            local_100 = (__m256 *)
                        ((long)local_e8->w * local_d8 * local_e8->elemsize + (long)local_e8->data);
            iVar29 = 0;
            do {
              local_e0 = CONCAT44(local_e0._4_4_,iVar29);
              local_a0 = *local_100;
              if (0 < (int)uVar54) {
                uVar30 = 0;
                do {
                  local_108 = (Mat *)CONCAT44(local_108._4_4_,uVar30);
                  iVar29 = (uint)local_110;
                  if (0 < (int)(uint)local_110) {
                    do {
                      local_c0 = *pafVar52;
                      BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                                (&local_111,&local_a0,&local_c0);
                      *pafVar39 = local_c0;
                      pafVar52 = pafVar52 + 1;
                      pafVar39 = pafVar39 + 1;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  uVar30 = (int)local_108 + 1;
                  uVar54 = (uint)local_f0;
                } while (uVar30 != (uint)local_f0);
              }
              local_100 = local_100 + 1;
              iVar29 = (int)local_e0 + 1;
            } while (iVar29 != (int)local_f8);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != local_d0);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,sVar7,iVar29,pAVar9);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (local_e8[1].dims != 1) {
        if (local_e8[1].dims != 2) {
          return 0;
        }
        pOVar36 = (Option *)opt->blob_allocator;
        a = local_e8;
LAB_003d17ef:
        iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                           (a,pMVar38,this_00,pOVar36);
        return iVar29;
      }
      Mat::create(this_00,(int)local_100,(int)local_108,sVar7,iVar29,opt->blob_allocator);
      puVar40 = (undefined8 *)this_00->data;
      if (puVar40 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (_elempack != 1 || local_e8[1].w != 1) {
        if ((int)local_108 < 1) {
          return 0;
        }
        pafVar39 = (__m256 *)local_e8->data;
        local_110 = (Option *)local_e8[1].data;
        local_f0 = (__m256 *)((ulong)local_f0._4_4_ << 0x20);
        do {
          local_a0 = *(__m256 *)local_110;
          uVar31 = (ulong)local_100 & 0xffffffff;
          if (0 < (int)local_100) {
            do {
              uVar94 = *(undefined8 *)*pafVar39;
              uVar93 = *(undefined8 *)(*pafVar39 + 2);
              uVar96 = *(undefined8 *)(*pafVar39 + 4);
              uVar97 = *(undefined8 *)(*pafVar39 + 6);
              local_c0 = *pafVar39;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_c0,&local_a0);
              *puVar40 = uVar94;
              puVar40[1] = uVar93;
              puVar40[2] = uVar96;
              puVar40[3] = uVar97;
              pafVar39 = pafVar39 + 1;
              puVar40 = puVar40 + 4;
              uVar54 = (int)uVar31 - 1;
              uVar31 = (ulong)uVar54;
            } while (uVar54 != 0);
          }
          local_110 = (Option *)((long)local_110 + 0x20);
          iVar29 = (uint)local_f0 + 1;
          local_f0 = (__m256 *)CONCAT44(local_f0._4_4_,iVar29);
        } while (iVar29 != (int)local_108);
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        local_5c = (uint)local_f0 ^ 1;
        local_f8 = CONCAT44(local_f8._4_4_,uVar50) ^ 1;
        if (uVar5 == uVar49 && (uVar50 == 1 && local_5c == 0)) {
          local_e8 = a;
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          local_108 = (Mat *)0x0;
          do {
            local_a0 = *(__m256 *)
                        ((long)local_e8[1].data +
                        local_e8[1].cstep * (long)local_108 * local_e8[1].elemsize);
            if (0 < (int)local_e0) {
              local_f0 = (__m256 *)
                         ((long)this_00->data + this_00->cstep * this_00->elemsize * (long)local_108
                         );
              local_110 = (Option *)
                          ((long)local_e8->data +
                          local_e8->cstep * local_e8->elemsize * (long)local_108);
              lVar55 = 0;
              iVar29 = (int)local_e0;
              do {
                pafVar39 = (__m256 *)((long)local_110 + lVar55);
                uVar94 = *(undefined8 *)*pafVar39;
                uVar93 = *(undefined8 *)(*pafVar39 + 2);
                uVar96 = *(undefined8 *)(*pafVar39 + 4);
                uVar97 = *(undefined8 *)(*pafVar39 + 6);
                local_c0 = *pafVar39;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_c0,&local_a0);
                puVar40 = (undefined8 *)((long)local_f0 + lVar55);
                *puVar40 = uVar94;
                puVar40[1] = uVar93;
                puVar40[2] = uVar96;
                puVar40[3] = uVar97;
                lVar55 = lVar55 + 0x20;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
            }
            local_108 = (Mat *)((long)local_108 + 1);
          } while (local_108 != (Mat *)local_d8);
          return 0;
        }
        if (uVar50 == uVar54) {
          if (_elempack == 1 && (uVar5 == 1 && (uint)local_f0 == uVar30)) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d8 < 1) {
              return 0;
            }
            local_100 = (__m256 *)0x0;
            do {
              if (0 < (int)local_e0) {
                local_110 = (Option *)
                            (this_00->cstep * this_00->elemsize * (long)local_100 +
                            (long)this_00->data);
                local_108 = (Mat *)local_e8[1].data;
                local_f0 = (__m256 *)
                           (local_e8->cstep * local_e8->elemsize * (long)local_100 +
                           (long)local_e8->data);
                lVar55 = 0;
                iVar29 = (int)local_e0;
                do {
                  local_a0 = *(__m256 *)((long)local_f0 + lVar55 * 8);
                  fVar2 = *(float *)((long)local_108 + lVar55);
                  local_c0[1] = fVar2;
                  local_c0[0] = fVar2;
                  local_c0[2] = fVar2;
                  local_c0[3] = fVar2;
                  local_c0[4] = fVar2;
                  local_c0[5] = fVar2;
                  local_c0[6] = fVar2;
                  local_c0[7] = fVar2;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_111,&local_a0,&local_c0);
                  *(__m256 *)((long)local_110 + lVar55 * 8) = local_c0;
                  lVar55 = lVar55 + 4;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_100 = (__m256 *)((long)local_100 + 1);
            } while (local_100 != (__m256 *)local_d8);
            return 0;
          }
          local_e0 = CONCAT71(local_e0._1_7_,uVar54 == 1);
          if ((uVar54 == 1 && uVar30 == 1) && uVar5 == uVar49) {
LAB_003d96ef:
            local_e8 = a;
            Mat::create(this_00,uVar50,(uint)local_f0,uVar5,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d0 < 1) {
              return 0;
            }
            local_108 = (Mat *)0x0;
            do {
              local_a0 = *(__m256 *)
                          ((long)local_e8->data +
                          local_e8->cstep * (long)local_108 * local_e8->elemsize);
              if (0 < local_c4) {
                local_f0 = (__m256 *)
                           ((long)this_00->data +
                           this_00->cstep * this_00->elemsize * (long)local_108);
                local_110 = (Option *)
                            ((long)local_e8[1].data +
                            local_e8[1].cstep * local_e8[1].elemsize * (long)local_108);
                lVar55 = 0;
                iVar29 = local_c4;
                do {
                  pafVar39 = (__m256 *)((long)local_110 + lVar55);
                  uVar94 = *(undefined8 *)*pafVar39;
                  uVar93 = *(undefined8 *)(*pafVar39 + 2);
                  uVar96 = *(undefined8 *)(*pafVar39 + 4);
                  uVar97 = *(undefined8 *)(*pafVar39 + 6);
                  local_c0 = *pafVar39;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_111,&local_a0,&local_c0);
                  puVar40 = (undefined8 *)((long)local_f0 + lVar55);
                  *puVar40 = uVar94;
                  puVar40[1] = uVar93;
                  puVar40[2] = uVar96;
                  puVar40[3] = uVar97;
                  lVar55 = lVar55 + 0x20;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_108 = (Mat *)((long)local_108 + 1);
            } while (local_108 != (Mat *)local_d0);
            return 0;
          }
          if (((iVar29 == 1) && ((uint)local_f0 == uVar30)) && (uVar49 == 1)) {
            local_e8 = a;
            Mat::create(this_00,uVar54,uVar30,uVar5,sVar8,_elempack,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_d0 < 1) {
              return 0;
            }
            local_100 = (__m256 *)0x0;
            do {
              if (0 < local_c4) {
                local_f0 = (__m256 *)local_e8->data;
                local_110 = (Option *)
                            (this_00->cstep * this_00->elemsize * (long)local_100 +
                            (long)this_00->data);
                local_108 = (Mat *)(local_e8[1].cstep * local_e8[1].elemsize * (long)local_100 +
                                   (long)local_e8[1].data);
                lVar55 = 0;
                iVar29 = local_c4;
                do {
                  local_a0[1] = *(float *)((long)local_f0 + lVar55);
                  local_a0[0] = local_a0[1];
                  local_a0[2] = local_a0[1];
                  local_a0[3] = local_a0[1];
                  local_a0[4] = local_a0[1];
                  local_a0[5] = local_a0[1];
                  local_a0[6] = local_a0[1];
                  local_a0[7] = local_a0[1];
                  local_c0 = *(__m256 *)((long)local_108 + lVar55 * 8);
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_111,&local_a0,&local_c0);
                  *(__m256 *)((long)local_110 + lVar55 * 8) = local_c0;
                  lVar55 = lVar55 + 4;
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              local_100 = (__m256 *)((long)local_100 + 1);
            } while (local_100 != (__m256 *)local_d0);
            return 0;
          }
        }
        else {
          local_e0 = CONCAT71(local_e0._1_7_,uVar54 == 1);
          if ((uVar54 == 1 && uVar30 == 1) && uVar5 == uVar49) goto LAB_003d96ef;
        }
        local_c4._1_3_ = (undefined3)((uint)local_c4 >> 8);
        local_c4 = CONCAT31(local_c4._1_3_,uVar30 == 1);
        if ((((int)local_f8 == 0 && (uint)local_f0 == uVar30) && uVar49 == uVar5) && uVar54 != 1) {
          local_e8 = a;
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          local_f8 = 0;
          do {
            if (0 < (int)local_108) {
              local_f0 = (__m256 *)
                         (local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pafVar52 = (__m256 *)
                         (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
              pafVar39 = (__m256 *)
                         (local_e8->cstep * local_f8 * local_e8->elemsize + (long)local_e8->data);
              local_110 = (Option *)0x0;
              do {
                local_a0 = *(__m256 *)((long)local_f0 + (long)local_110 * 0x20);
                uVar31 = (ulong)local_100 & 0xffffffff;
                if (0 < (int)local_100) {
                  do {
                    local_c0 = *pafVar39;
                    BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                              (&local_111,&local_c0,&local_a0);
                    *pafVar52 = local_c0;
                    pafVar39 = pafVar39 + 1;
                    pafVar52 = pafVar52 + 1;
                    uVar54 = (int)uVar31 - 1;
                    uVar31 = (ulong)uVar54;
                  } while (uVar54 != 0);
                }
                local_110 = (Option *)((long)local_110 + 1);
              } while ((Mat *)local_110 != local_108);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != local_d8);
          return 0;
        }
        if (((uVar50 == uVar54 && local_5c == 0) && uVar49 == uVar5) && uVar30 != 1) {
          local_e8 = a;
          Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          lVar55 = (long)local_100 << 5;
          local_f8 = 0;
          local_f0 = (__m256 *)lVar55;
          do {
            if (0 < (int)local_108) {
              pvVar59 = (void *)(this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data
                                );
              pvVar56 = (void *)(local_e8->cstep * local_f8 * local_e8->elemsize +
                                (long)local_e8->data);
              lVar41 = local_e8[1].elemsize * local_e8[1].cstep * local_f8;
              pvVar42 = local_e8[1].data;
              iVar29 = 0;
              pafVar39 = local_100;
              pMVar38 = local_108;
              do {
                if (0 < (int)pafVar39) {
                  local_110 = (Option *)CONCAT44(local_110._4_4_,iVar29);
                  lVar51 = 0;
                  do {
                    local_a0 = *(__m256 *)((long)pvVar56 + lVar51);
                    local_c0 = *(__m256 *)((long)pvVar42 + lVar51 + lVar41);
                    BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                              (&local_111,&local_a0,&local_c0);
                    *(__m256 *)((long)pvVar59 + lVar51) = local_c0;
                    lVar51 = lVar51 + 0x20;
                  } while (lVar55 != lVar51);
                  pvVar59 = (void *)((long)pvVar59 + lVar51);
                  pvVar56 = (void *)((long)pvVar56 + lVar51);
                  pafVar39 = local_100;
                  pMVar38 = local_108;
                  iVar29 = (uint)local_110;
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != (int)pMVar38);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != local_d8);
          return 0;
        }
        if (((uVar5 == uVar49 && (uint)local_f0 == uVar30) & uVar50 != 1 & (byte)local_e0) == 1) {
          local_e8 = a;
          Mat::create(this_00,uVar50,uVar30,uVar49,sVar8,_elempack,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          local_f8 = 0;
          do {
            if (0 < (int)local_108) {
              local_100 = (__m256 *)
                          (local_e8->cstep * local_f8 * local_e8->elemsize + (long)local_e8->data);
              pafVar39 = (__m256 *)
                         (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
              pafVar52 = (__m256 *)
                         (local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              local_f0 = (__m256 *)0x0;
              do {
                local_a0 = *(__m256 *)((long)local_100 + (long)local_f0 * 0x20);
                iVar29 = (uint)local_110;
                if (0 < (int)(uint)local_110) {
                  do {
                    local_c0 = *pafVar52;
                    BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                              (&local_111,&local_a0,&local_c0);
                    *pafVar39 = local_c0;
                    pafVar52 = pafVar52 + 1;
                    pafVar39 = pafVar39 + 1;
                    iVar29 = iVar29 + -1;
                  } while (iVar29 != 0);
                }
                local_f0 = (__m256 *)((long)local_f0 + 1);
              } while ((Mat *)local_f0 != local_108);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != local_d8);
          return 0;
        }
        pOVar36 = (Option *)opt->blob_allocator;
        local_e8 = a;
        if ((uVar30 == 1 && uVar5 == uVar49) && ((uint)local_f0 != 1 && uVar50 == uVar54)) {
          Mat::create(this_00,uVar54,(uint)local_f0,uVar49,sVar8,_elempack,(Allocator *)pOVar36);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_d8 < 1) {
            return 0;
          }
          lVar55 = (long)local_100 << 5;
          local_f8 = 0;
          uVar54 = (uint)local_f0;
          local_108 = (Mat *)lVar55;
          do {
            uVar31 = local_d8;
            if (0 < (int)uVar54) {
              pvVar59 = (void *)(this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data
                                );
              pvVar56 = (void *)(local_e8[1].cstep * local_f8 * local_e8[1].elemsize +
                                (long)local_e8[1].data);
              lVar41 = local_e8->elemsize * local_e8->cstep * local_f8;
              pvVar42 = local_e8->data;
              uVar30 = 0;
              pafVar39 = local_100;
              do {
                if (0 < (int)pafVar39) {
                  local_110 = (Option *)CONCAT44(local_110._4_4_,uVar30);
                  lVar51 = 0;
                  do {
                    local_a0 = *(__m256 *)((long)pvVar42 + lVar51 + lVar41);
                    local_c0 = *(__m256 *)((long)pvVar56 + lVar51);
                    BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                              (&local_111,&local_a0,&local_c0);
                    *(__m256 *)((long)pvVar59 + lVar51) = local_c0;
                    lVar51 = lVar51 + 0x20;
                  } while (lVar55 != lVar51);
                  pvVar59 = (void *)((long)pvVar59 + lVar51);
                  pvVar56 = (void *)((long)pvVar56 + lVar51);
                  uVar31 = local_d8;
                  pafVar39 = local_100;
                  uVar54 = (uint)local_f0;
                  uVar30 = (uint)local_110;
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar54);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != uVar31);
          return 0;
        }
        goto LAB_003d17ef;
      }
      if (a[1].dims == 4) {
        local_e8 = a;
        Mat::create(this_00,uVar50,(uint)local_f0,iVar4,uVar5,sVar8,_elempack,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_d0 < 1) {
          return 0;
        }
        local_d8 = 0;
        uVar54 = (uint)local_f0;
        do {
          if (0 < (int)local_f8) {
            pafVar39 = (__m256 *)
                       (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
            pafVar52 = (__m256 *)
                       (local_e8[1].cstep * local_d8 * local_e8[1].elemsize + (long)local_e8[1].data
                       );
            local_108 = (Mat *)(local_e8->cstep * local_d8 * local_e8->elemsize +
                               (long)local_e8->data);
            iVar29 = 0;
            do {
              local_e0 = CONCAT44(local_e0._4_4_,iVar29);
              if (0 < (int)uVar54) {
                uVar30 = 0;
                do {
                  local_100 = (__m256 *)CONCAT44(local_100._4_4_,uVar30);
                  local_a0 = *(__m256 *)local_108;
                  iVar29 = (uint)local_110;
                  if (0 < (int)(uint)local_110) {
                    do {
                      local_c0 = *pafVar52;
                      BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                                (&local_111,&local_a0,&local_c0);
                      *pafVar39 = local_c0;
                      pafVar52 = pafVar52 + 1;
                      pafVar39 = pafVar39 + 1;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  local_108 = (Mat *)((long)local_108 + 0x20);
                  uVar30 = (int)local_100 + 1;
                  uVar54 = (uint)local_f0;
                } while (uVar30 != (uint)local_f0);
              }
              iVar29 = (int)local_e0 + 1;
            } while (iVar29 != (int)local_f8);
          }
          local_d8 = local_d8 + 1;
        } while (local_d8 != local_d0);
        return 0;
      }
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,uVar49,sVar7,iVar29,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (local_e8[1].dims != 1) {
        if (local_e8[1].dims != 2) {
          return 0;
        }
        if ((int)local_d8 < 1) {
          return 0;
        }
        local_f8 = 0;
        do {
          if (0 < (int)local_108) {
            pafVar39 = (__m256 *)
                       (this_00->cstep * local_f8 * this_00->elemsize + (long)this_00->data);
            local_110 = (Option *)
                        ((long)local_e8[1].w * local_f8 * local_e8[1].elemsize +
                        (long)local_e8[1].data);
            pafVar52 = (__m256 *)
                       (local_e8->cstep * local_f8 * local_e8->elemsize + (long)local_e8->data);
            local_f0._0_4_ = 0;
            do {
              local_a0 = *(__m256 *)local_110;
              uVar31 = (ulong)local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  local_c0 = *pafVar52;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_111,&local_c0,&local_a0);
                  *pafVar39 = local_c0;
                  pafVar52 = pafVar52 + 1;
                  pafVar39 = pafVar39 + 1;
                  uVar54 = (int)uVar31 - 1;
                  uVar31 = (ulong)uVar54;
                } while (uVar54 != 0);
              }
              local_110 = (Option *)((long)local_110 + 0x20);
              local_f0._0_4_ = (uint)local_f0 + 1;
            } while ((uint)local_f0 != (int)local_108);
          }
          local_f8 = local_f8 + 1;
        } while (local_f8 != local_d8);
        return 0;
      }
      if (_elempack != 1 || local_e8[1].w != 1) {
        if ((int)local_d8 < 1) {
          return 0;
        }
        local_108 = (Mat *)0x0;
        do {
          local_a0 = *(__m256 *)((long)local_e8[1].data + (long)local_108 * 0x20);
          if (0 < (int)local_e0) {
            local_f0 = (__m256 *)
                       (this_00->cstep * this_00->elemsize * (long)local_108 + (long)this_00->data);
            local_110 = (Option *)
                        ((long)local_e8->data +
                        local_e8->cstep * local_e8->elemsize * (long)local_108);
            lVar55 = 0;
            iVar29 = (int)local_e0;
            do {
              pafVar39 = (__m256 *)((long)local_110 + lVar55);
              uVar94 = *(undefined8 *)*pafVar39;
              uVar93 = *(undefined8 *)(*pafVar39 + 2);
              uVar96 = *(undefined8 *)(*pafVar39 + 4);
              uVar97 = *(undefined8 *)(*pafVar39 + 6);
              local_c0 = *pafVar39;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_c0,&local_a0);
              puVar40 = (undefined8 *)((long)local_f0 + lVar55);
              *puVar40 = uVar94;
              puVar40[1] = uVar93;
              puVar40[2] = uVar96;
              puVar40[3] = uVar97;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          local_108 = (Mat *)((long)local_108 + 1);
        } while (local_108 != (Mat *)local_d8);
        return 0;
      }
      break;
    case 4:
      local_f8 = CONCAT44(local_f8._4_4_,iVar33);
      pOVar36 = (Option *)opt->blob_allocator;
      if (a[1].dims == 4) goto LAB_003d17ef;
      local_e8 = a;
      Mat::create(this_00,uVar54,uVar30,iVar33,uVar49,sVar7,iVar29,(Allocator *)pOVar36);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_e8[1].dims;
      iVar33 = (int)local_d8;
      if (iVar29 != 1) {
        if (iVar29 == 3) {
          if (iVar33 < 1) {
            return 0;
          }
          local_d0 = 0;
          do {
            if (0 < (int)local_f8) {
              pafVar52 = (__m256 *)
                         (this_00->cstep * local_d0 * this_00->elemsize + (long)this_00->data);
              local_110 = (Option *)
                          (local_e8[1].cstep * local_d0 * local_e8[1].elemsize +
                          (long)local_e8[1].data);
              pafVar57 = (__m256 *)
                         (local_e8->cstep * local_d0 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              pafVar39 = local_100;
              pMVar38 = local_108;
              do {
                local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                if (0 < (int)pMVar38) {
                  local_f0._0_4_ = 0;
                  do {
                    local_a0 = *(__m256 *)local_110;
                    uVar31 = (ulong)pafVar39 & 0xffffffff;
                    if (0 < (int)pafVar39) {
                      do {
                        local_c0 = *pafVar57;
                        BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                                  (&local_111,&local_c0,&local_a0);
                        *pafVar52 = local_c0;
                        pafVar57 = pafVar57 + 1;
                        pafVar52 = pafVar52 + 1;
                        uVar54 = (int)uVar31 - 1;
                        uVar31 = (ulong)uVar54;
                      } while (uVar54 != 0);
                    }
                    local_110 = (Option *)((long)local_110 + 0x20);
                    local_f0._0_4_ = (uint)local_f0 + 1;
                    pafVar39 = local_100;
                    pMVar38 = local_108;
                  } while ((uint)local_f0 != (int)local_108);
                }
                iVar29 = (int)local_e0 + 1;
              } while (iVar29 != (int)local_f8);
            }
            local_d0 = local_d0 + 1;
          } while (local_d0 != local_d8);
          return 0;
        }
        if (iVar29 == 2) {
          if (iVar33 < 1) {
            return 0;
          }
          local_d0 = 0;
          do {
            if (0 < (int)local_f8) {
              pafVar52 = (__m256 *)
                         (this_00->cstep * local_d0 * this_00->elemsize + (long)this_00->data);
              local_f0 = (__m256 *)
                         ((long)local_e8[1].w * local_d0 * local_e8[1].elemsize +
                         (long)local_e8[1].data);
              pafVar57 = (__m256 *)
                         (local_e8->cstep * local_d0 * local_e8->elemsize + (long)local_e8->data);
              iVar29 = 0;
              pafVar39 = local_100;
              pMVar38 = local_108;
              do {
                local_e0 = CONCAT44(local_e0._4_4_,iVar29);
                local_a0 = *local_f0;
                if (0 < (int)pMVar38) {
                  iVar29 = 0;
                  do {
                    local_110 = (Option *)CONCAT44(local_110._4_4_,iVar29);
                    uVar31 = (ulong)pafVar39 & 0xffffffff;
                    if (0 < (int)pafVar39) {
                      do {
                        local_c0 = *pafVar57;
                        BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                                  (&local_111,&local_c0,&local_a0);
                        *pafVar52 = local_c0;
                        pafVar57 = pafVar57 + 1;
                        pafVar52 = pafVar52 + 1;
                        uVar54 = (int)uVar31 - 1;
                        uVar31 = (ulong)uVar54;
                      } while (uVar54 != 0);
                    }
                    iVar29 = (uint)local_110 + 1;
                    pafVar39 = local_100;
                    pMVar38 = local_108;
                  } while (iVar29 != (int)local_108);
                }
                local_f0 = local_f0 + 1;
                iVar29 = (int)local_e0 + 1;
              } while (iVar29 != (int)local_f8);
            }
            local_d0 = local_d0 + 1;
          } while (local_d0 != local_d8);
          return 0;
        }
        return 0;
      }
      if (_elempack != 1 || local_e8[1].w != 1) {
        if (iVar33 < 1) {
          return 0;
        }
        local_108 = (Mat *)0x0;
        do {
          local_a0 = *(__m256 *)((long)local_e8[1].data + (long)local_108 * 0x20);
          if (0 < (int)local_e0) {
            local_110 = (Option *)
                        ((long)local_e8->data +
                        local_e8->cstep * local_e8->elemsize * (long)local_108);
            local_f0 = (__m256 *)
                       (this_00->cstep * this_00->elemsize * (long)local_108 + (long)this_00->data);
            lVar55 = 0;
            iVar29 = (int)local_e0;
            do {
              pafVar39 = (__m256 *)((long)local_110 + lVar55);
              uVar94 = *(undefined8 *)*pafVar39;
              uVar93 = *(undefined8 *)(*pafVar39 + 2);
              uVar96 = *(undefined8 *)(*pafVar39 + 4);
              uVar97 = *(undefined8 *)(*pafVar39 + 6);
              local_c0 = *pafVar39;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_111,&local_c0,&local_a0);
              puVar40 = (undefined8 *)((long)local_f0 + lVar55);
              *puVar40 = uVar94;
              puVar40[1] = uVar93;
              puVar40[2] = uVar96;
              puVar40[3] = uVar97;
              lVar55 = lVar55 + 0x20;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          local_108 = (Mat *)((long)local_108 + 1);
        } while (local_108 != (Mat *)local_d8);
        return 0;
      }
    }
LAB_003da8f7:
    pOVar36 = (Option *)opt->blob_allocator;
    goto LAB_003da8fc;
  case 7:
    pMVar43 = a;
    a = pMVar38;
    break;
  case 8:
    pMVar43 = a;
    a = pMVar38;
LAB_003d06de:
    iVar29 = binary_op_pack8<ncnn::BinaryOp_x86_fma_functor::binary_op_div>(a,pMVar43,this_00,opt);
    return iVar29;
  default:
    goto switchD_003cffc9_default;
  }
  iVar29 = binary_op_pack8<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>(a,pMVar43,this_00,opt);
  return iVar29;
switchD_003d4482_caseD_1:
  local_e8 = a;
  Mat::create(this_00,uVar54,local_68,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  pOVar36 = (Option *)opt->blob_allocator;
  if (_elempack != 1 || local_e8[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
              (local_e8,pMVar38,this_00,pOVar36);
    return 0;
  }
  goto LAB_003da8fc;
switchD_003d0668_caseD_1:
  local_e8 = a;
  Mat::create(this_00,uVar54,sVar7,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  pOVar36 = (Option *)opt->blob_allocator;
  if (_elempack != 1 || local_e8[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
              (local_e8,pMVar38,this_00,pOVar36);
    return 0;
  }
LAB_003da8fc:
  iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                     (local_e8,pMVar38,this_00,pOVar36);
  return iVar29;
}

Assistant:

int BinaryOp_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_fma_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}